

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_fma::forward_fp16s
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int *piVar18;
  void *pvVar19;
  undefined4 *puVar20;
  void *pvVar21;
  size_t sVar22;
  uint *puVar23;
  float *pfVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  ulong uVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [32];
  long lVar38;
  long lVar39;
  undefined1 (*pauVar40) [32];
  long lVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  uint uVar53;
  long lVar54;
  undefined1 (*pauVar55) [16];
  long lVar56;
  undefined1 (*pauVar57) [16];
  long lVar58;
  undefined1 (*pauVar59) [16];
  undefined1 (*pauVar60) [16];
  undefined1 auVar61 [16];
  undefined1 auVar69 [16];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar62 [16];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [28];
  undefined1 auVar131 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar164 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar135 [16];
  undefined1 auVar174 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar144 [16];
  undefined1 auVar186 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar187 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar188 [64];
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar221 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  v4sf one;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar288 [64];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar307;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar319;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar320;
  float fVar324;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [32];
  undefined1 auVar325 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [64];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [64];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [64];
  undefined1 auVar361 [16];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  Option opt_flatten;
  undefined1 (*local_3b8) [32];
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  int local_3a0;
  Allocator *local_398;
  int local_390;
  int iStack_38c;
  undefined8 uStack_388;
  int iStack_380;
  size_t local_378;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  long local_308;
  ulong local_300;
  ulong local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  float local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined1 local_2a8 [32];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar380 [12];
  undefined1 auVar83 [32];
  undefined1 auVar87 [32];
  undefined1 auVar93 [32];
  float fVar96;
  undefined1 auVar123 [32];
  float fVar132;
  undefined1 auVar165 [32];
  
  local_390 = bottom_blob->dims;
  if ((local_390 == 2) &&
     (iVar43 = (this->super_InnerProduct).num_output,
     bottom_blob->w == (this->super_InnerProduct).weight_data_size / iVar43)) {
    Mat::create(top_blob,iVar43,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    innerproduct_gemm_fp16s_sse
              (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
               (this->super_InnerProduct).activation_type,
               &(this->super_InnerProduct).activation_params,opt);
    return 0;
  }
  piVar18 = bottom_blob->refcount;
  local_3b8 = (undefined1 (*) [32])bottom_blob->data;
  uStack_3b0 = SUB84(bottom_blob->refcount,0);
  uStack_3ac = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_3a8 = (undefined4)bottom_blob->elemsize;
  uStack_3a4 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_3a0 = bottom_blob->elempack;
  local_398 = bottom_blob->allocator;
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar4 = bottom_blob->d;
  uVar5 = bottom_blob->c;
  auVar380._8_4_ = uVar5;
  auVar380._4_4_ = uVar4;
  auVar380._0_4_ = uVar3;
  uStack_388 = auVar380._0_8_;
  local_378 = bottom_blob->cstep;
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + 1;
    UNLOCK();
  }
  iStack_38c = uVar2;
  iStack_380 = uVar5;
  if (bottom_blob->dims != 1) {
    auVar272[0] = opt->lightmode;
    auVar272[1] = opt->use_shader_pack8;
    auVar272[2] = opt->use_subgroup_ops;
    auVar272[3] = opt->use_reserved_0;
    auVar272._4_4_ = opt->num_threads;
    auVar272._8_8_ = opt->blob_allocator;
    uVar6 = opt->workspace_allocator;
    uVar7 = opt->openmp_blocktime;
    uVar8 = opt->use_winograd_convolution;
    uVar9 = opt->use_sgemm_convolution;
    uVar10 = opt->use_int8_inference;
    uVar11 = opt->use_vulkan_compute;
    auVar272[0x1f] = uVar11;
    auVar272[0x1e] = uVar10;
    auVar272[0x1d] = uVar9;
    auVar272[0x1c] = uVar8;
    auVar272._24_4_ = uVar7;
    auVar272._16_8_ = uVar6;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_4_ = opt->vulkan_device_index;
    uStack_50._4_1_ = opt->use_reserved_1;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_2;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_fp16_uniform;
    uStack_40._4_1_ = opt->use_int8_uniform;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar272._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar272._16_16_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_3b8);
    if ((local_3b8 == (undefined1 (*) [32])0x0) || ((long)iStack_380 * local_378 == 0)) {
      iVar43 = -100;
      goto LAB_00302e03;
    }
  }
  uVar34 = 1;
  if (opt->use_packing_layout == true) {
    uVar53 = (this->super_InnerProduct).num_output;
    uVar34 = 8;
    if ((uVar53 & 7) != 0) {
      uVar34 = (uint)((uVar53 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(this->super_InnerProduct).num_output / (int)uVar34,
              (ulong)uVar34 * (CONCAT44(uStack_3a4,local_3a8) / (ulong)(long)local_3a0),uVar34,
              opt->blob_allocator);
  iVar43 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar17 = (this->super_InnerProduct).activation_type;
    uVar53 = local_3a0 * iStack_38c;
    iVar33 = top_blob->elempack;
    uVar34 = top_blob->w;
    pvVar19 = (this->super_InnerProduct).bias_data.data;
    iVar43 = 0;
    if (iVar33 == 1) {
      if (0 < (int)uVar34 >> 3) {
        local_220 = (ulong)(uint)((int)uVar34 >> 3);
        lVar44 = 7;
        lVar39 = 6;
        lVar41 = 5;
        lVar42 = 4;
        lVar45 = 3;
        lVar58 = 2;
        lVar54 = 1;
        local_308 = 0;
        uVar36 = 0;
        do {
          local_300 = uVar36 * 8;
          auVar288 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar19 != (void *)0x0) {
            auVar288 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar19 + uVar36 * 0x20));
          }
          auVar272 = auVar288._0_32_;
          lVar35 = (long)(this->weight_data_tm).w;
          pvVar21 = (this->weight_data_tm).data;
          sVar22 = (this->weight_data_tm).elemsize;
          pauVar40 = local_3b8;
          if ((int)uVar53 < 8) {
            lVar35 = sVar22 * lVar35;
            lVar56 = lVar35 * local_300;
            lVar47 = (local_300 | 1) * lVar35;
            lVar46 = (local_300 | 2) * lVar35;
            lVar52 = (local_300 | 3) * lVar35;
            lVar51 = (local_300 | 4) * lVar35;
            lVar50 = (local_300 | 5) * lVar35;
            lVar49 = (local_300 | 6) * lVar35;
            lVar38 = (local_300 | 7) * lVar35;
            uVar32 = 0;
            local_b8 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            auVar190 = ZEXT816(0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            auVar134 = ZEXT816(0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar38 = sVar22 * lVar44 * lVar35;
            lVar49 = sVar22 * lVar39 * lVar35;
            lVar50 = sVar22 * lVar41 * lVar35;
            lVar51 = sVar22 * lVar42 * lVar35;
            lVar52 = sVar22 * lVar45 * lVar35;
            lVar46 = sVar22 * lVar58 * lVar35;
            lVar47 = sVar22 * lVar54 * lVar35;
            local_2a8._0_8_ = lVar47;
            lVar35 = sVar22 * local_308 * lVar35;
            auVar131 = ZEXT864(0);
            auVar134 = ZEXT816(0);
            auVar335 = ZEXT864(0);
            auVar266 = ZEXT864(0);
            auVar190 = ZEXT816(0);
            auVar379 = ZEXT864(0);
            auVar213 = ZEXT864(0);
            auVar188 = ZEXT864(0);
            iVar43 = 7;
            lVar56 = 0;
            do {
              auVar92 = *(undefined1 (*) [32])(*local_3b8 + lVar56 * 2);
              auVar217 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar56 + lVar35));
              auVar79 = vcvtph2ps_f16c(auVar217);
              auVar217 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar56 + lVar47));
              auVar90 = vcvtph2ps_f16c(auVar217);
              auVar217 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar56 + lVar46));
              auVar130 = vcvtph2ps_f16c(auVar217);
              auVar217 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar56 + lVar52));
              auVar186 = vcvtph2ps_f16c(auVar217);
              auVar217 = vfmadd231ps_fma(auVar131._0_32_,auVar92,auVar79);
              auVar131 = ZEXT1664(auVar217);
              local_98 = ZEXT1632(auVar217);
              auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar92,auVar90);
              auVar217 = vfmadd231ps_fma(auVar335._0_32_,auVar92,auVar130);
              auVar335 = ZEXT1664(auVar217);
              local_158 = ZEXT1632(auVar217);
              auVar217 = vfmadd231ps_fma(auVar266._0_32_,auVar92,auVar186);
              auVar266 = ZEXT1664(auVar217);
              local_138 = ZEXT1632(auVar217);
              auVar217 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar56 + lVar51));
              auVar79 = vcvtph2ps_f16c(auVar217);
              auVar217 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar56 + lVar50));
              auVar90 = vcvtph2ps_f16c(auVar217);
              auVar217 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar56 + lVar49));
              auVar130 = vcvtph2ps_f16c(auVar217);
              auVar217 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar21 + lVar56 + lVar38));
              auVar186 = vcvtph2ps_f16c(auVar217);
              auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar92,auVar79);
              auVar217 = vfmadd231ps_fma(auVar379._0_32_,auVar92,auVar90);
              auVar379 = ZEXT1664(auVar217);
              local_f8 = ZEXT1632(auVar217);
              auVar217 = vfmadd231ps_fma(auVar213._0_32_,auVar92,auVar130);
              auVar213 = ZEXT1664(auVar217);
              local_d8 = ZEXT1632(auVar217);
              auVar217 = vfmadd231ps_fma(auVar188._0_32_,auVar92,auVar186);
              auVar188 = ZEXT1664(auVar217);
              local_b8 = ZEXT1632(auVar217);
              pauVar40 = pauVar40 + 1;
              iVar43 = iVar43 + 8;
              lVar56 = lVar56 + 0x10;
            } while (iVar43 < (int)uVar53);
            lVar38 = lVar38 + lVar56;
            lVar49 = lVar49 + lVar56;
            lVar50 = lVar50 + lVar56;
            lVar51 = lVar51 + lVar56;
            lVar52 = lVar52 + lVar56;
            lVar46 = lVar46 + lVar56;
            lVar47 = lVar47 + lVar56;
            lVar56 = lVar35 + lVar56;
            uVar32 = uVar53 & 0xfffffff8;
          }
          local_118 = ZEXT1632(auVar190);
          local_178 = ZEXT1632(auVar134);
          local_338._0_8_ = (long)pvVar21 + lVar46;
          local_348._0_8_ = (long)pvVar21 + lVar52;
          local_358._0_8_ = (long)pvVar21 + lVar51;
          local_368._0_8_ = (long)pvVar21 + lVar50;
          local_2f8 = uVar36;
          local_2f0 = lVar54;
          local_2e8 = lVar58;
          local_2e0 = lVar45;
          local_2d8 = lVar42;
          local_2d0 = lVar41;
          local_2c8 = lVar39;
          local_2c0 = lVar44;
          if ((int)uVar32 < (int)uVar53) {
            lVar44 = 0;
            do {
              local_2a8 = auVar288._0_32_;
              uVar48 = *(uint *)(*pauVar40 + lVar44 * 4);
              fVar96 = float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar44 * 2 + lVar56));
              auVar272 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar96;
              fStack_210 = (float)extraout_XMM0_Dc;
              _fStack_208 = auVar272._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd;
              _local_318 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              fVar96 = float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar44 * 2 + lVar47));
              local_238 = CONCAT44(extraout_XMM0_Db_00,fVar96);
              local_328 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              local_248._0_4_ =
                   float16_to_float32(*(unsigned_short *)(local_338._0_8_ + lVar44 * 2));
              local_248._4_4_ = extraout_XMM0_Db_01;
              local_248._8_4_ = extraout_XMM0_Dc_00;
              local_248._12_4_ = extraout_XMM0_Dd_00;
              local_258 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              local_268._0_4_ =
                   float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar44 * 2));
              local_268._4_4_ = extraout_XMM0_Db_02;
              local_268._8_4_ = extraout_XMM0_Dc_01;
              local_268._12_4_ = extraout_XMM0_Dd_01;
              local_278 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              local_2b8 = float16_to_float32(*(unsigned_short *)(local_358._0_8_ + lVar44 * 2));
              local_288 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              uStack_2b4 = extraout_XMM0_Db_03;
              uStack_2b0 = extraout_XMM0_Dc_02;
              uStack_2ac = extraout_XMM0_Dd_02;
              fVar96 = float16_to_float32(*(unsigned_short *)(local_368._0_8_ + lVar44 * 2));
              auVar272 = local_198;
              local_198._4_4_ = extraout_XMM0_Db_04;
              local_198._0_4_ = fVar96;
              local_198._8_4_ = extraout_XMM0_Dc_03;
              local_198._16_16_ = auVar272._16_16_;
              local_198._12_4_ = extraout_XMM0_Dd_03;
              local_1b8._0_16_ = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              fVar96 = float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar44 * 2 + lVar49));
              auVar272 = local_1d8;
              local_1d8._4_4_ = extraout_XMM0_Db_05;
              local_1d8._0_4_ = fVar96;
              local_1d8._8_4_ = extraout_XMM0_Dc_04;
              local_1d8._16_16_ = auVar272._16_16_;
              local_1d8._12_4_ = extraout_XMM0_Dd_04;
              local_1f8._0_16_ = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
              auVar288._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar21 + lVar44 * 2 + lVar38));
              auVar288._4_60_ = extraout_var;
              auVar134._4_4_ = uStack_2b4;
              auVar134._0_4_ = local_2b8;
              auVar134._8_4_ = uStack_2b0;
              auVar134._12_4_ = uStack_2ac;
              auVar134 = vinsertps_avx(auVar134,ZEXT416((uint)local_198._0_4_),0x10);
              auVar134 = vinsertps_avx(auVar134,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar134 = vinsertps_avx(auVar134,auVar288._0_16_,0x30);
              auVar190 = vinsertps_avx(_local_218,ZEXT416((uint)local_238),0x10);
              auVar190 = vinsertps_avx(auVar190,ZEXT416((uint)local_248._0_4_),0x20);
              auVar190 = vinsertps_avx(auVar190,ZEXT416((uint)local_268._0_4_),0x30);
              auVar92._16_16_ = auVar134;
              auVar92._0_16_ = auVar190;
              auVar134 = vinsertps_avx(local_278,ZEXT416((uint)local_288._0_4_),0x10);
              auVar134 = vinsertps_avx(auVar134,ZEXT416((uint)local_1b8._0_4_),0x20);
              auVar134 = vinsertps_avx(auVar134,ZEXT416((uint)local_1f8._0_4_),0x30);
              auVar190 = vinsertps_avx(ZEXT416(uVar48),ZEXT416((uint)local_318._0_4_),0x10);
              auVar190 = vinsertps_avx(auVar190,ZEXT416((uint)local_328._0_4_),0x20);
              auVar190 = vinsertps_avx(auVar190,ZEXT416((uint)local_258._0_4_),0x30);
              auVar79._16_16_ = auVar134;
              auVar79._0_16_ = auVar190;
              auVar134 = vfmadd231ps_fma(local_2a8,auVar92,auVar79);
              auVar288 = ZEXT1664(auVar134);
              auVar272 = ZEXT1632(auVar134);
              lVar44 = lVar44 + 1;
            } while (uVar53 - uVar32 != (int)lVar44);
          }
          auVar92 = vhaddps_avx(local_98,local_178);
          auVar79 = vhaddps_avx(local_158,local_138);
          auVar79 = vhaddps_avx(auVar92,auVar79);
          auVar92 = vhaddps_avx(local_118,local_f8);
          auVar90 = vhaddps_avx(local_d8,local_b8);
          auVar90 = vhaddps_avx(auVar92,auVar90);
          auVar92 = vblendps_avx(auVar79,auVar90,0xf0);
          auVar79 = vperm2f128_avx(auVar79,auVar90,0x21);
          fVar96 = auVar79._0_4_ + auVar272._0_4_ + auVar92._0_4_;
          fVar132 = auVar79._4_4_ + auVar272._4_4_ + auVar92._4_4_;
          auVar90._0_8_ = CONCAT44(fVar132,fVar96);
          auVar90._8_4_ = auVar79._8_4_ + auVar272._8_4_ + auVar92._8_4_;
          auVar90._12_4_ = auVar79._12_4_ + auVar272._12_4_ + auVar92._12_4_;
          auVar90._16_4_ = auVar79._16_4_ + auVar272._16_4_ + auVar92._16_4_;
          auVar90._20_4_ = auVar79._20_4_ + auVar272._20_4_ + auVar92._20_4_;
          auVar90._24_4_ = auVar79._24_4_ + auVar272._24_4_ + auVar92._24_4_;
          auVar90._28_4_ = auVar79._28_4_ + auVar272._28_4_ + auVar92._28_4_;
          switch(iVar17) {
          case 1:
            auVar90 = vmaxps_avx(auVar90,_DAT_005f41a0);
            break;
          case 2:
            auVar272 = vmaxps_avx(auVar90,ZEXT832(0) << 0x20);
            auVar92 = vminps_avx(auVar90,ZEXT832(0) << 0x20);
            uVar1 = *(this->super_InnerProduct).activation_params.data;
            auVar95._4_4_ = uVar1;
            auVar95._0_4_ = uVar1;
            auVar95._8_4_ = uVar1;
            auVar95._12_4_ = uVar1;
            auVar95._16_4_ = uVar1;
            auVar95._20_4_ = uVar1;
            auVar95._24_4_ = uVar1;
            auVar95._28_4_ = uVar1;
            auVar134 = vfmadd213ps_fma(auVar95,auVar92,auVar272);
            auVar90 = ZEXT1632(auVar134);
            break;
          case 3:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar20;
            auVar125._4_4_ = uVar1;
            auVar125._0_4_ = uVar1;
            auVar125._8_4_ = uVar1;
            auVar125._12_4_ = uVar1;
            auVar125._16_4_ = uVar1;
            auVar125._20_4_ = uVar1;
            auVar125._24_4_ = uVar1;
            auVar125._28_4_ = uVar1;
            uVar1 = puVar20[1];
            auVar183._4_4_ = uVar1;
            auVar183._0_4_ = uVar1;
            auVar183._8_4_ = uVar1;
            auVar183._12_4_ = uVar1;
            auVar183._16_4_ = uVar1;
            auVar183._20_4_ = uVar1;
            auVar183._24_4_ = uVar1;
            auVar183._28_4_ = uVar1;
            auVar272 = vmaxps_avx(auVar90,auVar125);
            auVar90 = vminps_avx(auVar272,auVar183);
            break;
          case 4:
            auVar91._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
            auVar91._8_4_ = -auVar90._8_4_;
            auVar91._12_4_ = -auVar90._12_4_;
            auVar91._16_4_ = -auVar90._16_4_;
            auVar91._20_4_ = -auVar90._20_4_;
            auVar91._24_4_ = -auVar90._24_4_;
            auVar91._28_4_ = -auVar90._28_4_;
            auVar126._8_4_ = 0x42b0c0a5;
            auVar126._0_8_ = 0x42b0c0a542b0c0a5;
            auVar126._12_4_ = 0x42b0c0a5;
            auVar126._16_4_ = 0x42b0c0a5;
            auVar126._20_4_ = 0x42b0c0a5;
            auVar126._24_4_ = 0x42b0c0a5;
            auVar126._28_4_ = 0x42b0c0a5;
            auVar272 = vminps_avx(auVar91,auVar126);
            auVar127._8_4_ = 0xc2b0c0a5;
            auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar127._12_4_ = 0xc2b0c0a5;
            auVar127._16_4_ = 0xc2b0c0a5;
            auVar127._20_4_ = 0xc2b0c0a5;
            auVar127._24_4_ = 0xc2b0c0a5;
            auVar127._28_4_ = 0xc2b0c0a5;
            auVar92 = vmaxps_avx(auVar272,auVar127);
            auVar128._8_4_ = 0x3fb8aa3b;
            auVar128._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar128._12_4_ = 0x3fb8aa3b;
            auVar128._16_4_ = 0x3fb8aa3b;
            auVar128._20_4_ = 0x3fb8aa3b;
            auVar128._24_4_ = 0x3fb8aa3b;
            auVar128._28_4_ = 0x3fb8aa3b;
            auVar242._8_4_ = 0x3f000000;
            auVar242._0_8_ = 0x3f0000003f000000;
            auVar242._12_4_ = 0x3f000000;
            auVar242._16_4_ = 0x3f000000;
            auVar242._20_4_ = 0x3f000000;
            auVar242._24_4_ = 0x3f000000;
            auVar242._28_4_ = 0x3f000000;
            auVar134 = vfmadd213ps_fma(auVar128,auVar92,auVar242);
            auVar79 = vroundps_avx(ZEXT1632(auVar134),1);
            auVar272 = vcmpps_avx(ZEXT1632(auVar134),auVar79,1);
            auVar265._8_4_ = 0x3f800000;
            auVar265._0_8_ = 0x3f8000003f800000;
            auVar265._12_4_ = 0x3f800000;
            auVar265._16_4_ = 0x3f800000;
            auVar265._20_4_ = 0x3f800000;
            auVar265._24_4_ = 0x3f800000;
            auVar265._28_4_ = 0x3f800000;
            auVar272 = vandps_avx(auVar272,auVar265);
            auVar272 = vsubps_avx(auVar79,auVar272);
            auVar184._8_4_ = 0x3f318000;
            auVar184._0_8_ = 0x3f3180003f318000;
            auVar184._12_4_ = 0x3f318000;
            auVar184._16_4_ = 0x3f318000;
            auVar184._20_4_ = 0x3f318000;
            auVar184._24_4_ = 0x3f318000;
            auVar184._28_4_ = 0x3f318000;
            auVar134 = vfmsub231ps_fma(auVar92,auVar272,auVar184);
            auVar185._8_4_ = 0x395e8083;
            auVar185._0_8_ = 0x395e8083395e8083;
            auVar185._12_4_ = 0x395e8083;
            auVar185._16_4_ = 0x395e8083;
            auVar185._20_4_ = 0x395e8083;
            auVar185._24_4_ = 0x395e8083;
            auVar185._28_4_ = 0x395e8083;
            auVar190 = vfmsub231ps_fma(ZEXT1632(auVar134),auVar272,auVar185);
            auVar92 = ZEXT1632(auVar190);
            auVar30._28_4_ = 0x395e8083;
            auVar30._0_28_ =
                 ZEXT1628(CONCAT412(auVar190._12_4_ * auVar190._12_4_,
                                    CONCAT48(auVar190._8_4_ * auVar190._8_4_,
                                             CONCAT44(auVar190._4_4_ * auVar190._4_4_,
                                                      auVar190._0_4_ * auVar190._0_4_))));
            auVar212._8_4_ = 0x39506967;
            auVar212._0_8_ = 0x3950696739506967;
            auVar212._12_4_ = 0x39506967;
            auVar212._16_4_ = 0x39506967;
            auVar212._20_4_ = 0x39506967;
            auVar212._24_4_ = 0x39506967;
            auVar212._28_4_ = 0x39506967;
            auVar284._8_4_ = 0x3ab743ce;
            auVar284._0_8_ = 0x3ab743ce3ab743ce;
            auVar284._12_4_ = 0x3ab743ce;
            auVar284._16_4_ = 0x3ab743ce;
            auVar284._20_4_ = 0x3ab743ce;
            auVar284._24_4_ = 0x3ab743ce;
            auVar284._28_4_ = 0x3ab743ce;
            auVar134 = vfmadd213ps_fma(auVar212,auVar92,auVar284);
            auVar285._8_4_ = 0x3c088908;
            auVar285._0_8_ = 0x3c0889083c088908;
            auVar285._12_4_ = 0x3c088908;
            auVar285._16_4_ = 0x3c088908;
            auVar285._20_4_ = 0x3c088908;
            auVar285._24_4_ = 0x3c088908;
            auVar285._28_4_ = 0x3c088908;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar285);
            auVar286._8_4_ = 0x3d2aa9c1;
            auVar286._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar286._12_4_ = 0x3d2aa9c1;
            auVar286._16_4_ = 0x3d2aa9c1;
            auVar286._20_4_ = 0x3d2aa9c1;
            auVar286._24_4_ = 0x3d2aa9c1;
            auVar286._28_4_ = 0x3d2aa9c1;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar286);
            auVar287._8_4_ = 0x3e2aaaaa;
            auVar287._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar287._12_4_ = 0x3e2aaaaa;
            auVar287._16_4_ = 0x3e2aaaaa;
            auVar287._20_4_ = 0x3e2aaaaa;
            auVar287._24_4_ = 0x3e2aaaaa;
            auVar287._28_4_ = 0x3e2aaaaa;
            auVar92 = ZEXT1632(auVar190);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar287);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar242);
            auVar217 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar30,auVar92);
            auVar69._0_4_ = (int)auVar272._0_4_;
            auVar69._4_4_ = (int)auVar272._4_4_;
            auVar69._8_4_ = (int)auVar272._8_4_;
            auVar69._12_4_ = (int)auVar272._12_4_;
            auVar93._16_4_ = (int)auVar272._16_4_;
            auVar93._0_16_ = auVar69;
            auVar93._20_4_ = (int)auVar272._20_4_;
            auVar93._24_4_ = (int)auVar272._24_4_;
            auVar93._28_4_ = (int)auVar272._28_4_;
            auVar190 = vpslld_avx(auVar69,0x17);
            auVar134 = vpslld_avx(auVar93._16_16_,0x17);
            auVar144._8_4_ = 0x3f800000;
            auVar144._0_8_ = 0x3f8000003f800000;
            auVar144._12_4_ = 0x3f800000;
            auVar134 = vpaddd_avx(auVar134,auVar144);
            auVar190 = vpaddd_avx(auVar190,auVar144);
            auVar94._16_16_ = auVar134;
            auVar94._0_16_ = auVar190;
            auVar129._0_4_ = auVar217._0_4_ + 1.0;
            auVar129._4_4_ = auVar217._4_4_ + 1.0;
            auVar129._8_4_ = auVar217._8_4_ + 1.0;
            auVar129._12_4_ = auVar217._12_4_ + 1.0;
            auVar129._16_4_ = 0x3f800000;
            auVar129._20_4_ = 0x3f800000;
            auVar129._24_4_ = 0x3f800000;
            auVar129._28_4_ = 0x3f800000;
            auVar134 = vfmadd213ps_fma(auVar94,auVar129,auVar265);
            auVar90 = vdivps_avx(auVar265,ZEXT1632(auVar134));
            break;
          case 5:
            auVar306._8_4_ = 0x42b0c0a5;
            auVar306._0_8_ = 0x42b0c0a542b0c0a5;
            auVar306._12_4_ = 0x42b0c0a5;
            auVar306._16_4_ = 0x42b0c0a5;
            auVar306._20_4_ = 0x42b0c0a5;
            auVar306._24_4_ = 0x42b0c0a5;
            auVar306._28_4_ = 0x42b0c0a5;
            auVar272 = vminps_avx(auVar90,auVar306);
            auVar317._8_4_ = 0xc2b0c0a5;
            auVar317._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar317._12_4_ = 0xc2b0c0a5;
            auVar317._16_4_ = 0xc2b0c0a5;
            auVar317._20_4_ = 0xc2b0c0a5;
            auVar317._24_4_ = 0xc2b0c0a5;
            auVar317._28_4_ = 0xc2b0c0a5;
            auVar92 = vmaxps_avx(auVar317,auVar272);
            auVar175._8_4_ = 0x3fb8aa3b;
            auVar175._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar175._12_4_ = 0x3fb8aa3b;
            auVar175._16_4_ = 0x3fb8aa3b;
            auVar175._20_4_ = 0x3fb8aa3b;
            auVar175._24_4_ = 0x3fb8aa3b;
            auVar175._28_4_ = 0x3fb8aa3b;
            auVar334._8_4_ = 0x3f000000;
            auVar334._0_8_ = 0x3f0000003f000000;
            auVar334._12_4_ = 0x3f000000;
            auVar334._16_4_ = 0x3f000000;
            auVar334._20_4_ = 0x3f000000;
            auVar334._24_4_ = 0x3f000000;
            auVar334._28_4_ = 0x3f000000;
            auVar134 = vfmadd213ps_fma(auVar175,auVar92,auVar334);
            auVar79 = vroundps_avx(ZEXT1632(auVar134),1);
            auVar272 = vcmpps_avx(ZEXT1632(auVar134),auVar79,1);
            auVar353._8_4_ = 0x3f800000;
            auVar353._0_8_ = 0x3f8000003f800000;
            auVar353._12_4_ = 0x3f800000;
            auVar353._16_4_ = 0x3f800000;
            auVar353._20_4_ = 0x3f800000;
            auVar353._24_4_ = 0x3f800000;
            auVar353._28_4_ = 0x3f800000;
            auVar272 = vandps_avx(auVar353,auVar272);
            auVar272 = vsubps_avx(auVar79,auVar272);
            auVar359._8_4_ = 0x3f318000;
            auVar359._0_8_ = 0x3f3180003f318000;
            auVar359._12_4_ = 0x3f318000;
            auVar359._16_4_ = 0x3f318000;
            auVar359._20_4_ = 0x3f318000;
            auVar359._24_4_ = 0x3f318000;
            auVar359._28_4_ = 0x3f318000;
            auVar134 = vfmsub231ps_fma(auVar92,auVar272,auVar359);
            auVar318._8_4_ = 0xb95e8083;
            auVar318._0_8_ = 0xb95e8083b95e8083;
            auVar318._12_4_ = 0xb95e8083;
            auVar318._16_4_ = 0xb95e8083;
            auVar318._20_4_ = 0xb95e8083;
            auVar318._24_4_ = 0xb95e8083;
            auVar318._28_4_ = 0xb95e8083;
            auVar190 = vfnmsub231ps_fma(ZEXT1632(auVar134),auVar272,auVar318);
            auVar92 = ZEXT1632(auVar190);
            auVar114._28_4_ = auVar79._28_4_;
            auVar114._0_28_ =
                 ZEXT1628(CONCAT412(auVar190._12_4_ * auVar190._12_4_,
                                    CONCAT48(auVar190._8_4_ * auVar190._8_4_,
                                             CONCAT44(auVar190._4_4_ * auVar190._4_4_,
                                                      auVar190._0_4_ * auVar190._0_4_))));
            auVar372._8_4_ = 0x39506967;
            auVar372._0_8_ = 0x3950696739506967;
            auVar372._12_4_ = 0x39506967;
            auVar372._16_4_ = 0x39506967;
            auVar372._20_4_ = 0x39506967;
            auVar372._24_4_ = 0x39506967;
            auVar372._28_4_ = 0x39506967;
            auVar365._8_4_ = 0x3ab743ce;
            auVar365._0_8_ = 0x3ab743ce3ab743ce;
            auVar365._12_4_ = 0x3ab743ce;
            auVar365._16_4_ = 0x3ab743ce;
            auVar365._20_4_ = 0x3ab743ce;
            auVar365._24_4_ = 0x3ab743ce;
            auVar365._28_4_ = 0x3ab743ce;
            auVar134 = vfmadd213ps_fma(auVar372,auVar92,auVar365);
            auVar378._8_4_ = 0x3c088908;
            auVar378._0_8_ = 0x3c0889083c088908;
            auVar378._12_4_ = 0x3c088908;
            auVar378._16_4_ = 0x3c088908;
            auVar378._20_4_ = 0x3c088908;
            auVar378._24_4_ = 0x3c088908;
            auVar378._28_4_ = 0x3c088908;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar378);
            auVar258._8_4_ = 0x3d2aa9c1;
            auVar258._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar258._12_4_ = 0x3d2aa9c1;
            auVar258._16_4_ = 0x3d2aa9c1;
            auVar258._20_4_ = 0x3d2aa9c1;
            auVar258._24_4_ = 0x3d2aa9c1;
            auVar258._28_4_ = 0x3d2aa9c1;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar258);
            auVar259._8_4_ = 0x3e2aaaaa;
            auVar259._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar259._12_4_ = 0x3e2aaaaa;
            auVar259._16_4_ = 0x3e2aaaaa;
            auVar259._20_4_ = 0x3e2aaaaa;
            auVar259._24_4_ = 0x3e2aaaaa;
            auVar259._28_4_ = 0x3e2aaaaa;
            auVar92 = ZEXT1632(auVar190);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar259);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar334);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar114,auVar92);
            auVar209._0_4_ = auVar134._0_4_ + 1.0;
            auVar209._4_4_ = auVar134._4_4_ + 1.0;
            auVar209._8_4_ = auVar134._8_4_ + 1.0;
            auVar209._12_4_ = auVar134._12_4_ + 1.0;
            auVar209._16_4_ = 0x3f800000;
            auVar209._20_4_ = 0x3f800000;
            auVar209._24_4_ = 0x3f800000;
            auVar209._28_4_ = 0x3f800000;
            auVar190._0_4_ = (int)auVar272._0_4_;
            auVar190._4_4_ = (int)auVar272._4_4_;
            auVar190._8_4_ = (int)auVar272._8_4_;
            auVar190._12_4_ = (int)auVar272._12_4_;
            auVar121._16_4_ = (int)auVar272._16_4_;
            auVar121._0_16_ = auVar190;
            auVar121._20_4_ = (int)auVar272._20_4_;
            auVar121._24_4_ = (int)auVar272._24_4_;
            auVar121._28_4_ = (int)auVar272._28_4_;
            auVar190 = vpslld_avx(auVar190,0x17);
            auVar134 = vpslld_avx(auVar121._16_16_,0x17);
            auVar291._8_4_ = 0x3f800000;
            auVar291._0_8_ = 0x3f8000003f800000;
            auVar291._12_4_ = 0x3f800000;
            auVar134 = vpaddd_avx(auVar134,auVar291);
            auVar190 = vpaddd_avx(auVar190,auVar291);
            auVar122._16_16_ = auVar134;
            auVar122._0_16_ = auVar190;
            auVar217 = vfmadd213ps_fma(auVar122,auVar209,auVar353);
            auVar176._8_4_ = 0x800000;
            auVar176._0_8_ = 0x80000000800000;
            auVar176._12_4_ = 0x800000;
            auVar176._16_4_ = 0x800000;
            auVar176._20_4_ = 0x800000;
            auVar176._24_4_ = 0x800000;
            auVar176._28_4_ = 0x800000;
            auVar272 = vmaxps_avx(ZEXT1632(auVar217),auVar176);
            auVar190 = vpsrld_avx(auVar272._0_16_,0x17);
            auVar134 = vpsrld_avx(auVar272._16_16_,0x17);
            auVar260._8_4_ = 0x807fffff;
            auVar260._0_8_ = 0x807fffff807fffff;
            auVar260._12_4_ = 0x807fffff;
            auVar260._16_4_ = 0x807fffff;
            auVar260._20_4_ = 0x807fffff;
            auVar260._24_4_ = 0x807fffff;
            auVar260._28_4_ = 0x807fffff;
            auVar272 = vandps_avx(auVar272,auVar260);
            auVar79 = vorps_avx(auVar334,auVar272);
            auVar261._8_4_ = 0x3f3504f3;
            auVar261._0_8_ = 0x3f3504f33f3504f3;
            auVar261._12_4_ = 0x3f3504f3;
            auVar261._16_4_ = 0x3f3504f3;
            auVar261._20_4_ = 0x3f3504f3;
            auVar261._24_4_ = 0x3f3504f3;
            auVar261._28_4_ = 0x3f3504f3;
            auVar92 = vcmpps_avx(auVar261,auVar79,2);
            auVar272 = vandnps_avx(auVar92,auVar79);
            auVar347._8_4_ = 0xbf800000;
            auVar347._0_8_ = 0xbf800000bf800000;
            auVar347._12_4_ = 0xbf800000;
            auVar347._16_4_ = 0xbf800000;
            auVar347._20_4_ = 0xbf800000;
            auVar347._24_4_ = 0xbf800000;
            auVar347._28_4_ = 0xbf800000;
            auVar177._0_4_ = auVar79._0_4_ + -1.0 + auVar272._0_4_;
            auVar177._4_4_ = auVar79._4_4_ + -1.0 + auVar272._4_4_;
            auVar177._8_4_ = auVar79._8_4_ + -1.0 + auVar272._8_4_;
            auVar177._12_4_ = auVar79._12_4_ + -1.0 + auVar272._12_4_;
            auVar177._16_4_ = auVar79._16_4_ + -1.0 + auVar272._16_4_;
            auVar177._20_4_ = auVar79._20_4_ + -1.0 + auVar272._20_4_;
            auVar177._24_4_ = auVar79._24_4_ + -1.0 + auVar272._24_4_;
            auVar177._28_4_ = auVar79._28_4_ + -1.0 + auVar272._28_4_;
            auVar134 = vpsubd_avx(auVar134,auVar92._16_16_);
            auVar268._8_4_ = 0xffffff81;
            auVar268._0_8_ = 0xffffff81ffffff81;
            auVar268._12_4_ = 0xffffff81;
            auVar134 = vpaddd_avx(auVar134,auVar268);
            auVar190 = vpsubd_avx(auVar190,auVar92._0_16_);
            auVar190 = vpaddd_avx(auVar190,auVar268);
            auVar210._16_16_ = auVar134;
            auVar210._0_16_ = auVar190;
            auVar241._0_4_ = auVar177._0_4_ * auVar177._0_4_;
            auVar241._4_4_ = auVar177._4_4_ * auVar177._4_4_;
            auVar241._8_4_ = auVar177._8_4_ * auVar177._8_4_;
            auVar241._12_4_ = auVar177._12_4_ * auVar177._12_4_;
            auVar241._16_4_ = auVar177._16_4_ * auVar177._16_4_;
            auVar241._20_4_ = auVar177._20_4_ * auVar177._20_4_;
            auVar241._24_4_ = auVar177._24_4_ * auVar177._24_4_;
            auVar241._28_4_ = 0;
            auVar262._8_4_ = 0x3d9021bb;
            auVar262._0_8_ = 0x3d9021bb3d9021bb;
            auVar262._12_4_ = 0x3d9021bb;
            auVar262._16_4_ = 0x3d9021bb;
            auVar262._20_4_ = 0x3d9021bb;
            auVar262._24_4_ = 0x3d9021bb;
            auVar262._28_4_ = 0x3d9021bb;
            auVar274._8_4_ = 0xbdebd1b8;
            auVar274._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar274._12_4_ = 0xbdebd1b8;
            auVar274._16_4_ = 0xbdebd1b8;
            auVar274._20_4_ = 0xbdebd1b8;
            auVar274._24_4_ = 0xbdebd1b8;
            auVar274._28_4_ = 0xbdebd1b8;
            auVar134 = vfmadd213ps_fma(auVar262,auVar177,auVar274);
            auVar275._8_4_ = 0x3def251a;
            auVar275._0_8_ = 0x3def251a3def251a;
            auVar275._12_4_ = 0x3def251a;
            auVar275._16_4_ = 0x3def251a;
            auVar275._20_4_ = 0x3def251a;
            auVar275._24_4_ = 0x3def251a;
            auVar275._28_4_ = 0x3def251a;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar177,auVar275);
            auVar276._8_4_ = 0xbdfe5d4f;
            auVar276._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar276._12_4_ = 0xbdfe5d4f;
            auVar276._16_4_ = 0xbdfe5d4f;
            auVar276._20_4_ = 0xbdfe5d4f;
            auVar276._24_4_ = 0xbdfe5d4f;
            auVar276._28_4_ = 0xbdfe5d4f;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar177,auVar276);
            auVar277._8_4_ = 0x3e11e9bf;
            auVar277._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar277._12_4_ = 0x3e11e9bf;
            auVar277._16_4_ = 0x3e11e9bf;
            auVar277._20_4_ = 0x3e11e9bf;
            auVar277._24_4_ = 0x3e11e9bf;
            auVar277._28_4_ = 0x3e11e9bf;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar177,auVar277);
            auVar278._8_4_ = 0xbe2aae50;
            auVar278._0_8_ = 0xbe2aae50be2aae50;
            auVar278._12_4_ = 0xbe2aae50;
            auVar278._16_4_ = 0xbe2aae50;
            auVar278._20_4_ = 0xbe2aae50;
            auVar278._24_4_ = 0xbe2aae50;
            auVar278._28_4_ = 0xbe2aae50;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar177,auVar278);
            auVar279._8_4_ = 0x3e4cceac;
            auVar279._0_8_ = 0x3e4cceac3e4cceac;
            auVar279._12_4_ = 0x3e4cceac;
            auVar279._16_4_ = 0x3e4cceac;
            auVar279._20_4_ = 0x3e4cceac;
            auVar279._24_4_ = 0x3e4cceac;
            auVar279._28_4_ = 0x3e4cceac;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar177,auVar279);
            auVar280._8_4_ = 0xbe7ffffc;
            auVar280._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar280._12_4_ = 0xbe7ffffc;
            auVar280._16_4_ = 0xbe7ffffc;
            auVar280._20_4_ = 0xbe7ffffc;
            auVar280._24_4_ = 0xbe7ffffc;
            auVar280._28_4_ = 0xbe7ffffc;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar177,auVar280);
            auVar281._8_4_ = 0x3eaaaaaa;
            auVar281._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar281._12_4_ = 0x3eaaaaaa;
            auVar281._16_4_ = 0x3eaaaaaa;
            auVar281._20_4_ = 0x3eaaaaaa;
            auVar281._24_4_ = 0x3eaaaaaa;
            auVar281._28_4_ = 0x3eaaaaaa;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar177,auVar281);
            auVar263._0_4_ = auVar241._0_4_ * auVar177._0_4_ * auVar134._0_4_;
            auVar263._4_4_ = auVar241._4_4_ * auVar177._4_4_ * auVar134._4_4_;
            auVar263._8_4_ = auVar241._8_4_ * auVar177._8_4_ * auVar134._8_4_;
            auVar263._12_4_ = auVar241._12_4_ * auVar177._12_4_ * auVar134._12_4_;
            auVar263._16_4_ = auVar241._16_4_ * auVar177._16_4_ * 0.0;
            auVar263._20_4_ = auVar241._20_4_ * auVar177._20_4_ * 0.0;
            auVar263._24_4_ = auVar241._24_4_ * auVar177._24_4_ * 0.0;
            auVar263._28_4_ = 0;
            auVar92 = vcvtdq2ps_avx(auVar210);
            auVar134 = vfmadd231ps_fma(auVar263,auVar92,auVar318);
            auVar134 = vfmsub231ps_fma(ZEXT1632(auVar134),auVar334,auVar241);
            auVar272 = vcmpps_avx(ZEXT1632(auVar217),_DAT_005f41a0,2);
            auVar79 = vsubps_avx(ZEXT1632(auVar134),auVar177);
            auVar134 = vfmsub231ps_fma(auVar79,auVar359,auVar92);
            auVar264._8_4_ = 0xc0000000;
            auVar264._0_8_ = 0xc0000000c0000000;
            auVar264._12_4_ = 0xc0000000;
            auVar264._16_4_ = 0xc0000000;
            auVar264._20_4_ = 0xc0000000;
            auVar264._24_4_ = 0xc0000000;
            auVar264._28_4_ = 0xc0000000;
            auVar178._0_4_ = auVar134._0_4_ * -2.0;
            auVar178._4_4_ = auVar134._4_4_ * -2.0;
            auVar178._8_4_ = auVar134._8_4_ * -2.0;
            auVar178._12_4_ = auVar134._12_4_ * -2.0;
            auVar178._16_4_ = 0x80000000;
            auVar178._20_4_ = 0x80000000;
            auVar178._24_4_ = 0x80000000;
            auVar178._28_4_ = 0;
            auVar211._8_4_ = 0x7fffffff;
            auVar211._0_8_ = 0x7fffffff7fffffff;
            auVar211._12_4_ = 0x7fffffff;
            auVar211._16_4_ = 0x7fffffff;
            auVar211._20_4_ = 0x7fffffff;
            auVar211._24_4_ = 0x7fffffff;
            auVar211._28_4_ = 0x7fffffff;
            auVar272 = vblendvps_avx(auVar178,auVar211,auVar272);
            auVar179._8_4_ = 0x42b0c0a5;
            auVar179._0_8_ = 0x42b0c0a542b0c0a5;
            auVar179._12_4_ = 0x42b0c0a5;
            auVar179._16_4_ = 0x42b0c0a5;
            auVar179._20_4_ = 0x42b0c0a5;
            auVar179._24_4_ = 0x42b0c0a5;
            auVar179._28_4_ = 0x42b0c0a5;
            auVar272 = vminps_avx(auVar272,auVar179);
            auVar180._8_4_ = 0xc2b0c0a5;
            auVar180._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar180._12_4_ = 0xc2b0c0a5;
            auVar180._16_4_ = 0xc2b0c0a5;
            auVar180._20_4_ = 0xc2b0c0a5;
            auVar180._24_4_ = 0xc2b0c0a5;
            auVar180._28_4_ = 0xc2b0c0a5;
            auVar92 = vmaxps_avx(auVar272,auVar180);
            auVar181._8_4_ = 0x3fb8aa3b;
            auVar181._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar181._12_4_ = 0x3fb8aa3b;
            auVar181._16_4_ = 0x3fb8aa3b;
            auVar181._20_4_ = 0x3fb8aa3b;
            auVar181._24_4_ = 0x3fb8aa3b;
            auVar181._28_4_ = 0x3fb8aa3b;
            auVar134 = vfmadd213ps_fma(auVar181,auVar92,auVar334);
            auVar79 = vroundps_avx(ZEXT1632(auVar134),1);
            auVar272 = vcmpps_avx(ZEXT1632(auVar134),auVar79,1);
            auVar272 = vandps_avx(auVar353,auVar272);
            auVar272 = vsubps_avx(auVar79,auVar272);
            auVar134 = vfmsub231ps_fma(auVar92,auVar272,auVar359);
            auVar190 = vfnmsub231ps_fma(ZEXT1632(auVar134),auVar272,auVar318);
            auVar92 = ZEXT1632(auVar190);
            auVar25._28_4_ = auVar79._28_4_;
            auVar25._0_28_ =
                 ZEXT1628(CONCAT412(auVar190._12_4_ * auVar190._12_4_,
                                    CONCAT48(auVar190._8_4_ * auVar190._8_4_,
                                             CONCAT44(auVar190._4_4_ * auVar190._4_4_,
                                                      auVar190._0_4_ * auVar190._0_4_))));
            auVar134 = vfmadd213ps_fma(auVar372,auVar92,auVar365);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar378);
            auVar282._8_4_ = 0x3d2aa9c1;
            auVar282._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar282._12_4_ = 0x3d2aa9c1;
            auVar282._16_4_ = 0x3d2aa9c1;
            auVar282._20_4_ = 0x3d2aa9c1;
            auVar282._24_4_ = 0x3d2aa9c1;
            auVar282._28_4_ = 0x3d2aa9c1;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar282);
            auVar283._8_4_ = 0x3e2aaaaa;
            auVar283._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar283._12_4_ = 0x3e2aaaaa;
            auVar283._16_4_ = 0x3e2aaaaa;
            auVar283._20_4_ = 0x3e2aaaaa;
            auVar283._24_4_ = 0x3e2aaaaa;
            auVar283._28_4_ = 0x3e2aaaaa;
            auVar92 = ZEXT1632(auVar190);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar283);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar92,auVar334);
            auVar217 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar25,auVar92);
            auVar101._0_4_ = (int)auVar272._0_4_;
            auVar101._4_4_ = (int)auVar272._4_4_;
            auVar101._8_4_ = (int)auVar272._8_4_;
            auVar101._12_4_ = (int)auVar272._12_4_;
            auVar123._16_4_ = (int)auVar272._16_4_;
            auVar123._0_16_ = auVar101;
            auVar123._20_4_ = (int)auVar272._20_4_;
            auVar123._24_4_ = (int)auVar272._24_4_;
            auVar123._28_4_ = (int)auVar272._28_4_;
            auVar190 = vpslld_avx(auVar101,0x17);
            auVar134 = vpslld_avx(auVar123._16_16_,0x17);
            auVar134 = vpaddd_avx(auVar134,auVar291);
            auVar190 = vpaddd_avx(auVar190,auVar291);
            auVar124._16_16_ = auVar134;
            auVar124._0_16_ = auVar190;
            auVar182._0_4_ = auVar217._0_4_ + 1.0;
            auVar182._4_4_ = auVar217._4_4_ + 1.0;
            auVar182._8_4_ = auVar217._8_4_ + 1.0;
            auVar182._12_4_ = auVar217._12_4_ + 1.0;
            auVar182._16_4_ = 0x3f800000;
            auVar182._20_4_ = 0x3f800000;
            auVar182._24_4_ = 0x3f800000;
            auVar182._28_4_ = 0x3f800000;
            auVar134 = vfmadd213ps_fma(auVar124,auVar182,auVar353);
            auVar272 = vdivps_avx(auVar353,ZEXT1632(auVar134));
            auVar134 = vfnmadd213ps_fma(auVar272,auVar264,auVar347);
            auVar113 = ZEXT1628(auVar134);
            goto LAB_00302d50;
          case 6:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar20;
            auVar130._4_4_ = uVar1;
            auVar130._0_4_ = uVar1;
            auVar130._8_4_ = uVar1;
            auVar130._12_4_ = uVar1;
            auVar130._16_4_ = uVar1;
            auVar130._20_4_ = uVar1;
            auVar130._24_4_ = uVar1;
            auVar130._28_4_ = uVar1;
            uVar1 = puVar20[1];
            auVar186._4_4_ = uVar1;
            auVar186._0_4_ = uVar1;
            auVar186._8_4_ = uVar1;
            auVar186._12_4_ = uVar1;
            auVar186._16_4_ = uVar1;
            auVar186._20_4_ = uVar1;
            auVar186._24_4_ = uVar1;
            auVar186._28_4_ = uVar1;
            auVar134 = vfmadd231ps_fma(auVar186,auVar90,auVar130);
            auVar272 = vmaxps_avx(ZEXT1632(auVar134),_DAT_005f41a0);
            auVar187._8_4_ = 0x3f800000;
            auVar187._0_8_ = 0x3f8000003f800000;
            auVar187._12_4_ = 0x3f800000;
            auVar187._16_4_ = 0x3f800000;
            auVar187._20_4_ = 0x3f800000;
            auVar187._24_4_ = 0x3f800000;
            auVar187._28_4_ = 0x3f800000;
            auVar272 = vminps_avx(auVar272,auVar187);
            auVar113 = auVar272._0_28_;
LAB_00302d50:
            auVar90._4_4_ = auVar113._4_4_ * fVar132;
            auVar90._0_4_ = auVar113._0_4_ * fVar96;
            auVar90._8_4_ = auVar113._8_4_ * auVar90._8_4_;
            auVar90._12_4_ = auVar113._12_4_ * auVar90._12_4_;
            auVar90._16_4_ = auVar113._16_4_ * auVar90._16_4_;
            auVar90._20_4_ = auVar113._20_4_ * auVar90._20_4_;
            auVar90._24_4_ = auVar113._24_4_ * auVar90._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + local_300 * 4) = auVar90;
          uVar36 = local_2f8 + 1;
          lVar44 = local_2c0 + 8;
          lVar39 = local_2c8 + 8;
          lVar41 = local_2d0 + 8;
          lVar42 = local_2d8 + 8;
          lVar45 = local_2e0 + 8;
          lVar58 = local_2e8 + 8;
          lVar54 = local_2f0 + 8;
          local_308 = local_308 + 8;
        } while (uVar36 != local_220);
      }
      auVar190 = local_278;
      auVar134 = local_288;
      local_238 = (ulong)(int)uVar34;
      uVar36 = local_238 & 0xfffffffffffffff8;
      uVar32 = uVar34 >> 2 & 1;
      local_288._4_4_ = 0;
      local_288._0_4_ = uVar32;
      if (uVar32 != 0) {
        local_288._8_8_ = auVar134._8_8_;
        if (pvVar19 == (void *)0x0) {
          auVar134 = ZEXT816(0) << 0x40;
        }
        else {
          auVar134 = *(undefined1 (*) [16])((long)pvVar19 + uVar36 * 4);
        }
        pvVar21 = (this->weight_data_tm).data;
        lVar44 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pauVar59 = (undefined1 (*) [16])(lVar44 * uVar36 + (long)pvVar21);
        pauVar60 = (undefined1 (*) [16])((uVar36 | 1) * lVar44 + (long)pvVar21);
        pauVar55 = (undefined1 (*) [16])((uVar36 | 2) * lVar44 + (long)pvVar21);
        pauVar57 = (undefined1 (*) [16])((uVar36 | 3) * lVar44 + (long)pvVar21);
        pauVar40 = local_3b8;
        if ((int)uVar53 < 8) {
          uVar32 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar32 = uVar53 & 0xfffffff8;
          auVar288 = ZEXT864(0);
          iVar43 = 7;
          auVar188 = ZEXT864(0);
          auVar213 = ZEXT864(0);
          auVar131 = ZEXT864(0);
          do {
            auVar272 = *pauVar40;
            auVar217 = vlddqu_avx(*pauVar59);
            auVar92 = vcvtph2ps_f16c(auVar217);
            auVar217 = vlddqu_avx(*pauVar60);
            auVar79 = vcvtph2ps_f16c(auVar217);
            auVar217 = vlddqu_avx(*pauVar55);
            auVar90 = vcvtph2ps_f16c(auVar217);
            auVar217 = vlddqu_avx(*pauVar57);
            auVar130 = vcvtph2ps_f16c(auVar217);
            auVar217 = vfmadd231ps_fma(auVar131._0_32_,auVar272,auVar92);
            auVar131 = ZEXT1664(auVar217);
            local_1b8 = ZEXT1632(auVar217);
            auVar217 = vfmadd231ps_fma(auVar213._0_32_,auVar272,auVar79);
            auVar213 = ZEXT1664(auVar217);
            local_1f8 = ZEXT1632(auVar217);
            auVar217 = vfmadd231ps_fma(auVar188._0_32_,auVar272,auVar90);
            auVar188 = ZEXT1664(auVar217);
            local_1d8 = ZEXT1632(auVar217);
            auVar217 = vfmadd231ps_fma(auVar288._0_32_,auVar272,auVar130);
            auVar288 = ZEXT1664(auVar217);
            local_198 = ZEXT1632(auVar217);
            pauVar40 = pauVar40 + 1;
            pauVar59 = pauVar59 + 1;
            pauVar60 = pauVar60 + 1;
            pauVar55 = pauVar55 + 1;
            pauVar57 = pauVar57 + 1;
            iVar43 = iVar43 + 8;
          } while (iVar43 < (int)uVar53);
        }
        local_348 = ZEXT816(0) << 0x40;
        local_2b8 = (float)uVar36;
        uStack_2b4 = (undefined4)(uVar36 >> 0x20);
        if ((int)(uVar32 | 3) < (int)uVar53) {
          local_338 = ZEXT816(0);
          lVar44 = 0;
          auVar288 = ZEXT864(0);
          local_368 = ZEXT816(0);
          pauVar37 = pauVar40;
          uVar48 = uVar32;
          do {
            auVar217._8_8_ = 0;
            auVar217._0_8_ = *(ulong *)(*pauVar59 + lVar44);
            auVar101 = vcvtph2ps_f16c(auVar217);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = *(ulong *)(*pauVar60 + lVar44);
            auVar268 = vcvtph2ps_f16c(auVar13);
            auVar14._8_8_ = 0;
            auVar14._0_8_ = *(ulong *)(*pauVar55 + lVar44);
            auVar291 = vcvtph2ps_f16c(auVar14);
            auVar217 = *(undefined1 (*) [16])(*pauVar40 + lVar44 * 2);
            auVar15._8_8_ = 0;
            auVar15._0_8_ = *(ulong *)(*pauVar57 + lVar44);
            auVar69 = vcvtph2ps_f16c(auVar15);
            local_348 = vfmadd231ps_fma(local_348,auVar217,auVar101);
            local_368 = vfmadd231ps_fma(local_368,auVar217,auVar268);
            local_358 = vfmadd231ps_fma(auVar288._0_16_,auVar217,auVar291);
            auVar288 = ZEXT1664(local_358);
            local_338 = vfmadd231ps_fma(local_338,auVar217,auVar69);
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            uVar32 = uVar48 + 4;
            iVar43 = uVar48 + 7;
            lVar44 = lVar44 + 8;
            uVar48 = uVar32;
          } while (iVar43 < (int)uVar53);
          pauVar57 = (undefined1 (*) [16])(*pauVar57 + lVar44);
          pauVar55 = (undefined1 (*) [16])(*pauVar55 + lVar44);
          pauVar60 = (undefined1 (*) [16])(*pauVar60 + lVar44);
          pauVar59 = (undefined1 (*) [16])(*pauVar59 + lVar44);
          pauVar40 = pauVar37;
        }
        else {
          local_368 = ZEXT816(0);
          local_358 = SUB6416(ZEXT864(0),0);
          local_338 = ZEXT816(0);
        }
        local_278._4_4_ = 0;
        local_278._0_4_ = uVar53 - uVar32;
        local_278._8_8_ = auVar190._8_8_;
        if (uVar53 - uVar32 != 0 && (int)uVar32 <= (int)uVar53) {
          lVar44 = 0;
          do {
            local_2a8._0_16_ = auVar134;
            uVar32 = *(uint *)(*pauVar40 + lVar44 * 4);
            fVar96 = float16_to_float32(*(unsigned_short *)(*pauVar59 + lVar44 * 2));
            auVar272 = _local_218;
            local_218._4_4_ = extraout_XMM0_Db_06;
            local_218._0_4_ = fVar96;
            fStack_210 = (float)extraout_XMM0_Dc_05;
            _fStack_208 = auVar272._16_16_;
            fStack_20c = (float)extraout_XMM0_Dd_05;
            _local_318 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
            local_328._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar60 + lVar44 * 2));
            local_328._4_4_ = extraout_XMM0_Db_07;
            local_328._8_4_ = extraout_XMM0_Dc_06;
            local_328._12_4_ = extraout_XMM0_Dd_06;
            local_248 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
            local_258._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar55 + lVar44 * 2));
            local_258._4_4_ = extraout_XMM0_Db_08;
            local_258._8_4_ = extraout_XMM0_Dc_07;
            local_258._12_4_ = extraout_XMM0_Dd_07;
            local_268 = ZEXT416(*(uint *)(*pauVar40 + lVar44 * 4));
            auVar131._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar57 + lVar44 * 2));
            auVar131._4_60_ = extraout_var_00;
            auVar134 = vinsertps_avx(_local_218,ZEXT416((uint)local_328._0_4_),0x10);
            auVar134 = vinsertps_avx(auVar134,ZEXT416((uint)local_258._0_4_),0x20);
            auVar134 = vinsertps_avx(auVar134,auVar131._0_16_,0x30);
            auVar190 = vinsertps_avx(ZEXT416(uVar32),ZEXT416((uint)local_318._0_4_),0x10);
            auVar190 = vinsertps_avx(auVar190,ZEXT416((uint)local_248._0_4_),0x20);
            auVar190 = vinsertps_avx(auVar190,ZEXT416((uint)local_268._0_4_),0x30);
            auVar134 = vfmadd231ps_fma(local_2a8._0_16_,auVar134,auVar190);
            lVar44 = lVar44 + 1;
          } while (local_278._0_4_ != (int)lVar44);
        }
        auVar272 = vhaddps_avx(local_1b8,local_1f8);
        auVar92 = vhaddps_avx(local_1d8,local_198);
        auVar272 = vhaddps_avx(auVar272,auVar92);
        auVar217 = vunpcklps_avx(local_348,local_368);
        auVar101 = vunpcklps_avx(local_358,local_338);
        auVar268 = vunpckhps_avx(local_348,local_368);
        auVar291 = vunpckhps_avx(local_358,local_338);
        auVar190 = vmovlhps_avx(auVar217,auVar101);
        auVar101 = vunpckhpd_avx(auVar217,auVar101);
        auVar217 = vmovlhps_avx(auVar268,auVar291);
        auVar268 = vunpckhpd_avx(auVar268,auVar291);
        auVar70._0_4_ =
             auVar101._0_4_ + auVar190._0_4_ + auVar217._0_4_ + auVar268._0_4_ +
             auVar134._0_4_ + auVar272._0_4_ + auVar272._16_4_;
        auVar70._4_4_ =
             auVar101._4_4_ + auVar190._4_4_ + auVar217._4_4_ + auVar268._4_4_ +
             auVar134._4_4_ + auVar272._4_4_ + auVar272._20_4_;
        auVar70._8_4_ =
             auVar101._8_4_ + auVar190._8_4_ + auVar217._8_4_ + auVar268._8_4_ +
             auVar134._8_4_ + auVar272._8_4_ + auVar272._24_4_;
        auVar70._12_4_ =
             auVar101._12_4_ + auVar190._12_4_ + auVar217._12_4_ + auVar268._12_4_ +
             auVar134._12_4_ + auVar272._12_4_ + auVar272._28_4_;
        switch(iVar17) {
        case 1:
          auVar70 = vmaxps_avx(auVar70,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar134 = vmaxps_avx(auVar70,ZEXT816(0) << 0x20);
          auVar190 = vminps_avx(auVar70,ZEXT816(0) << 0x20);
          uVar1 = *(this->super_InnerProduct).activation_params.data;
          auVar74._4_4_ = uVar1;
          auVar74._0_4_ = uVar1;
          auVar74._8_4_ = uVar1;
          auVar74._12_4_ = uVar1;
          auVar70 = vfmadd213ps_fma(auVar74,auVar190,auVar134);
          break;
        case 3:
          puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar20;
          auVar106._4_4_ = uVar1;
          auVar106._0_4_ = uVar1;
          auVar106._8_4_ = uVar1;
          auVar106._12_4_ = uVar1;
          uVar1 = puVar20[1];
          auVar157._4_4_ = uVar1;
          auVar157._0_4_ = uVar1;
          auVar157._8_4_ = uVar1;
          auVar157._12_4_ = uVar1;
          auVar134 = vmaxps_avx(auVar70,auVar106);
          auVar70 = vminps_avx(auVar134,auVar157);
          break;
        case 4:
          uVar36 = CONCAT44(auVar70._4_4_,auVar70._0_4_);
          auVar71._0_8_ = uVar36 ^ 0x8000000080000000;
          auVar71._8_4_ = -auVar70._8_4_;
          auVar71._12_4_ = -auVar70._12_4_;
          auVar107._8_4_ = 0x42b0c0a5;
          auVar107._0_8_ = 0x42b0c0a542b0c0a5;
          auVar107._12_4_ = 0x42b0c0a5;
          auVar134 = vminps_avx(auVar71,auVar107);
          auVar108._8_4_ = 0xc2b0c0a5;
          auVar108._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar108._12_4_ = 0xc2b0c0a5;
          auVar217 = vmaxps_avx(auVar134,auVar108);
          auVar72._8_4_ = 0x3fb8aa3b;
          auVar72._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar72._12_4_ = 0x3fb8aa3b;
          auVar158._8_4_ = 0x3f000000;
          auVar158._0_8_ = 0x3f0000003f000000;
          auVar158._12_4_ = 0x3f000000;
          auVar134 = vfmadd213ps_fma(auVar72,auVar217,auVar158);
          auVar203._0_4_ = (int)auVar134._0_4_;
          auVar203._4_4_ = (int)auVar134._4_4_;
          auVar203._8_4_ = (int)auVar134._8_4_;
          auVar203._12_4_ = (int)auVar134._12_4_;
          auVar190 = vcvtdq2ps_avx(auVar203);
          auVar134 = vcmpps_avx(auVar134,auVar190,1);
          auVar73._8_4_ = 0x3f800000;
          auVar73._0_8_ = 0x3f8000003f800000;
          auVar73._12_4_ = 0x3f800000;
          auVar134 = vandps_avx(auVar134,auVar73);
          auVar134 = vsubps_avx(auVar190,auVar134);
          auVar233._8_4_ = 0x3f318000;
          auVar233._0_8_ = 0x3f3180003f318000;
          auVar233._12_4_ = 0x3f318000;
          auVar190 = vfmsub213ps_fma(auVar233,auVar134,auVar217);
          auVar109._8_4_ = 0x395e8083;
          auVar109._0_8_ = 0x395e8083395e8083;
          auVar109._12_4_ = 0x395e8083;
          auVar217 = vfmsub213ps_fma(auVar109,auVar134,auVar190);
          auVar234._0_4_ = auVar217._0_4_ * auVar217._0_4_;
          auVar234._4_4_ = auVar217._4_4_ * auVar217._4_4_;
          auVar234._8_4_ = auVar217._8_4_ * auVar217._8_4_;
          auVar234._12_4_ = auVar217._12_4_ * auVar217._12_4_;
          auVar247._8_4_ = 0x3ab743ce;
          auVar247._0_8_ = 0x3ab743ce3ab743ce;
          auVar247._12_4_ = 0x3ab743ce;
          auVar270._8_4_ = 0x39506967;
          auVar270._0_8_ = 0x3950696739506967;
          auVar270._12_4_ = 0x39506967;
          auVar190 = vfmadd213ps_fma(auVar270,auVar217,auVar247);
          auVar248._8_4_ = 0x3c088908;
          auVar248._0_8_ = 0x3c0889083c088908;
          auVar248._12_4_ = 0x3c088908;
          auVar190 = vfmadd231ps_fma(auVar248,auVar217,auVar190);
          auVar271._8_4_ = 0x3d2aa9c1;
          auVar271._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar271._12_4_ = 0x3d2aa9c1;
          auVar190 = vfmadd231ps_fma(auVar271,auVar217,auVar190);
          auVar249._8_4_ = 0x3e2aaaaa;
          auVar249._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar249._12_4_ = 0x3e2aaaaa;
          auVar190 = vfmadd231ps_fma(auVar249,auVar217,auVar190);
          auVar190 = vfmadd213ps_fma(auVar190,auVar217,auVar158);
          auVar190 = vfmadd213ps_fma(auVar190,auVar234,auVar217);
          auVar110._0_4_ = auVar190._0_4_ + 1.0;
          auVar110._4_4_ = auVar190._4_4_ + 1.0;
          auVar110._8_4_ = auVar190._8_4_ + 1.0;
          auVar110._12_4_ = auVar190._12_4_ + 1.0;
          auVar159._0_4_ = (int)auVar134._0_4_;
          auVar159._4_4_ = (int)auVar134._4_4_;
          auVar159._8_4_ = (int)auVar134._8_4_;
          auVar159._12_4_ = (int)auVar134._12_4_;
          auVar134 = vpslld_avx(auVar159,0x17);
          auVar134 = vpaddd_avx(auVar134,auVar73);
          auVar134 = vfmadd213ps_fma(auVar134,auVar110,auVar73);
          auVar70 = vdivps_avx(auVar73,auVar134);
          break;
        case 5:
          auVar102._8_4_ = 0x42b0c0a5;
          auVar102._0_8_ = 0x42b0c0a542b0c0a5;
          auVar102._12_4_ = 0x42b0c0a5;
          auVar134 = vminps_avx(auVar70,auVar102);
          auVar145._8_4_ = 0xc2b0c0a5;
          auVar145._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar145._12_4_ = 0xc2b0c0a5;
          auVar217 = vmaxps_avx(auVar134,auVar145);
          auVar246._8_4_ = 0x3fb8aa3b;
          auVar246._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar246._12_4_ = 0x3fb8aa3b;
          auVar292._8_4_ = 0x3f000000;
          auVar292._0_8_ = 0x3f0000003f000000;
          auVar292._12_4_ = 0x3f000000;
          auVar134 = vfmadd213ps_fma(auVar246,auVar217,auVar292);
          auVar201._0_4_ = (int)auVar134._0_4_;
          auVar201._4_4_ = (int)auVar134._4_4_;
          auVar201._8_4_ = (int)auVar134._8_4_;
          auVar201._12_4_ = (int)auVar134._12_4_;
          auVar190 = vcvtdq2ps_avx(auVar201);
          auVar134 = vcmpps_avx(auVar134,auVar190,1);
          auVar269._8_4_ = 0x3f800000;
          auVar269._0_8_ = 0x3f8000003f800000;
          auVar269._12_4_ = 0x3f800000;
          auVar134 = vandps_avx(auVar134,auVar269);
          auVar134 = vsubps_avx(auVar190,auVar134);
          auVar202._8_4_ = 0x3f318000;
          auVar202._0_8_ = 0x3f3180003f318000;
          auVar202._12_4_ = 0x3f318000;
          auVar190 = vfmsub231ps_fma(auVar217,auVar134,auVar202);
          auVar313._8_4_ = 0xb95e8083;
          auVar313._0_8_ = 0xb95e8083b95e8083;
          auVar313._12_4_ = 0xb95e8083;
          auVar217 = vfnmsub231ps_fma(auVar190,auVar134,auVar313);
          auVar374._0_4_ = auVar217._0_4_ * auVar217._0_4_;
          auVar374._4_4_ = auVar217._4_4_ * auVar217._4_4_;
          auVar374._8_4_ = auVar217._8_4_ * auVar217._8_4_;
          auVar374._12_4_ = auVar217._12_4_ * auVar217._12_4_;
          auVar146._8_4_ = 0x3ab743ce;
          auVar146._0_8_ = 0x3ab743ce3ab743ce;
          auVar146._12_4_ = 0x3ab743ce;
          auVar103._8_4_ = 0x39506967;
          auVar103._0_8_ = 0x3950696739506967;
          auVar103._12_4_ = 0x39506967;
          auVar190 = vfmadd213ps_fma(auVar103,auVar217,auVar146);
          auVar344._8_4_ = 0x3c088908;
          auVar344._0_8_ = 0x3c0889083c088908;
          auVar344._12_4_ = 0x3c088908;
          auVar190 = vfmadd213ps_fma(auVar190,auVar217,auVar344);
          auVar350._8_4_ = 0x3d2aa9c1;
          auVar350._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar350._12_4_ = 0x3d2aa9c1;
          auVar190 = vfmadd213ps_fma(auVar190,auVar217,auVar350);
          auVar356._8_4_ = 0x3e2aaaaa;
          auVar356._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar356._12_4_ = 0x3e2aaaaa;
          auVar190 = vfmadd213ps_fma(auVar190,auVar217,auVar356);
          auVar190 = vfmadd213ps_fma(auVar190,auVar217,auVar292);
          auVar190 = vfmadd213ps_fma(auVar190,auVar374,auVar217);
          auVar222._0_4_ = auVar190._0_4_ + 1.0;
          auVar222._4_4_ = auVar190._4_4_ + 1.0;
          auVar222._8_4_ = auVar190._8_4_ + 1.0;
          auVar222._12_4_ = auVar190._12_4_ + 1.0;
          auVar367._0_4_ = (int)auVar134._0_4_;
          auVar367._4_4_ = (int)auVar134._4_4_;
          auVar367._8_4_ = (int)auVar134._8_4_;
          auVar367._12_4_ = (int)auVar134._12_4_;
          auVar134 = vpslld_avx(auVar367,0x17);
          auVar134 = vpaddd_avx(auVar134,auVar269);
          auVar134 = vfmadd213ps_fma(auVar134,auVar222,auVar269);
          auVar190 = vcmpps_avx(auVar134,ZEXT816(0) << 0x40,2);
          auVar223._8_4_ = 0x800000;
          auVar223._0_8_ = 0x80000000800000;
          auVar223._12_4_ = 0x800000;
          auVar134 = vmaxps_avx(auVar134,auVar223);
          auVar217 = vpsrld_avx(auVar134,0x17);
          auVar375._8_4_ = 0x807fffff;
          auVar375._0_8_ = 0x807fffff807fffff;
          auVar375._12_4_ = 0x807fffff;
          auVar134 = vandps_avx(auVar375,auVar134);
          auVar101 = vorps_avx(auVar134,auVar292);
          auVar376._8_4_ = 0xffffff82;
          auVar376._0_8_ = 0xffffff82ffffff82;
          auVar376._12_4_ = 0xffffff82;
          auVar268 = vpaddd_avx(auVar217,auVar376);
          auVar368._8_4_ = 0x3f3504f3;
          auVar368._0_8_ = 0x3f3504f33f3504f3;
          auVar368._12_4_ = 0x3f3504f3;
          auVar217 = vcmpps_avx(auVar101,auVar368,1);
          auVar134 = vandps_avx(auVar217,auVar101);
          auVar369._0_4_ = auVar101._0_4_ + -1.0 + auVar134._0_4_;
          auVar369._4_4_ = auVar101._4_4_ + -1.0 + auVar134._4_4_;
          auVar369._8_4_ = auVar101._8_4_ + -1.0 + auVar134._8_4_;
          auVar369._12_4_ = auVar101._12_4_ + -1.0 + auVar134._12_4_;
          auVar101 = vcvtdq2ps_avx(auVar268);
          auVar134 = vandps_avx(auVar217,auVar269);
          auVar134 = vsubps_avx(auVar101,auVar134);
          auVar147._8_4_ = 0xbdebd1b8;
          auVar147._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar147._12_4_ = 0xbdebd1b8;
          auVar224._8_4_ = 0x3d9021bb;
          auVar224._0_8_ = 0x3d9021bb3d9021bb;
          auVar224._12_4_ = 0x3d9021bb;
          auVar217 = vfmadd213ps_fma(auVar224,auVar369,auVar147);
          auVar148._8_4_ = 0x3def251a;
          auVar148._0_8_ = 0x3def251a3def251a;
          auVar148._12_4_ = 0x3def251a;
          auVar217 = vfmadd231ps_fma(auVar148,auVar369,auVar217);
          auVar225._8_4_ = 0xbdfe5d4f;
          auVar225._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar225._12_4_ = 0xbdfe5d4f;
          auVar217 = vfmadd231ps_fma(auVar225,auVar369,auVar217);
          auVar149._8_4_ = 0x3e11e9bf;
          auVar149._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar149._12_4_ = 0x3e11e9bf;
          auVar217 = vfmadd231ps_fma(auVar149,auVar369,auVar217);
          auVar226._8_4_ = 0xbe2aae50;
          auVar226._0_8_ = 0xbe2aae50be2aae50;
          auVar226._12_4_ = 0xbe2aae50;
          auVar217 = vfmadd231ps_fma(auVar226,auVar369,auVar217);
          auVar150._8_4_ = 0x3e4cceac;
          auVar150._0_8_ = 0x3e4cceac3e4cceac;
          auVar150._12_4_ = 0x3e4cceac;
          auVar217 = vfmadd231ps_fma(auVar150,auVar369,auVar217);
          auVar227._8_4_ = 0xbe7ffffc;
          auVar227._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar227._12_4_ = 0xbe7ffffc;
          auVar217 = vfmadd231ps_fma(auVar227,auVar369,auVar217);
          auVar151._8_4_ = 0x3eaaaaaa;
          auVar151._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar151._12_4_ = 0x3eaaaaaa;
          auVar217 = vfmadd231ps_fma(auVar151,auVar369,auVar217);
          auVar228._0_4_ = auVar369._0_4_ * auVar369._0_4_;
          auVar228._4_4_ = auVar369._4_4_ * auVar369._4_4_;
          auVar228._8_4_ = auVar369._8_4_ * auVar369._8_4_;
          auVar228._12_4_ = auVar369._12_4_ * auVar369._12_4_;
          auVar152._0_4_ = auVar369._0_4_ * auVar228._0_4_ * auVar217._0_4_;
          auVar152._4_4_ = auVar369._4_4_ * auVar228._4_4_ * auVar217._4_4_;
          auVar152._8_4_ = auVar369._8_4_ * auVar228._8_4_ * auVar217._8_4_;
          auVar152._12_4_ = auVar369._12_4_ * auVar228._12_4_ * auVar217._12_4_;
          auVar217 = vfmadd231ps_fma(auVar152,auVar134,auVar313);
          auVar217 = vfmsub231ps_fma(auVar217,auVar292,auVar228);
          auVar217 = vsubps_avx(auVar217,auVar369);
          auVar134 = vfnmadd231ps_fma(auVar217,auVar202,auVar134);
          auVar153._0_4_ = auVar134._0_4_ + auVar134._0_4_;
          auVar153._4_4_ = auVar134._4_4_ + auVar134._4_4_;
          auVar153._8_4_ = auVar134._8_4_ + auVar134._8_4_;
          auVar153._12_4_ = auVar134._12_4_ + auVar134._12_4_;
          auVar229._8_4_ = 0x7fffffff;
          auVar229._0_8_ = 0x7fffffff7fffffff;
          auVar229._12_4_ = 0x7fffffff;
          auVar134 = vblendvps_avx(auVar153,auVar229,auVar190);
          auVar230._8_4_ = 0x42b0c0a5;
          auVar230._0_8_ = 0x42b0c0a542b0c0a5;
          auVar230._12_4_ = 0x42b0c0a5;
          auVar134 = vminps_avx(auVar134,auVar230);
          auVar231._8_4_ = 0xc2b0c0a5;
          auVar231._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar231._12_4_ = 0xc2b0c0a5;
          auVar217 = vmaxps_avx(auVar134,auVar231);
          auVar134 = vfmadd213ps_fma(auVar246,auVar217,auVar292);
          auVar232._0_4_ = (int)auVar134._0_4_;
          auVar232._4_4_ = (int)auVar134._4_4_;
          auVar232._8_4_ = (int)auVar134._8_4_;
          auVar232._12_4_ = (int)auVar134._12_4_;
          auVar190 = vcvtdq2ps_avx(auVar232);
          auVar134 = vcmpps_avx(auVar134,auVar190,1);
          auVar134 = vandps_avx(auVar134,auVar269);
          auVar134 = vsubps_avx(auVar190,auVar134);
          auVar190 = vfmsub213ps_fma(auVar202,auVar134,auVar217);
          auVar217 = vfnmsub231ps_fma(auVar190,auVar134,auVar313);
          auVar154._8_4_ = 0x3ab743ce;
          auVar154._0_8_ = 0x3ab743ce3ab743ce;
          auVar154._12_4_ = 0x3ab743ce;
          auVar190 = vfmadd213ps_fma(auVar103,auVar217,auVar154);
          auVar190 = vfmadd213ps_fma(auVar190,auVar217,auVar344);
          auVar190 = vfmadd213ps_fma(auVar190,auVar217,auVar350);
          auVar190 = vfmadd213ps_fma(auVar190,auVar217,auVar356);
          auVar190 = vfmadd213ps_fma(auVar190,auVar217,auVar292);
          auVar155._0_4_ = auVar217._0_4_ * auVar217._0_4_;
          auVar155._4_4_ = auVar217._4_4_ * auVar217._4_4_;
          auVar155._8_4_ = auVar217._8_4_ * auVar217._8_4_;
          auVar155._12_4_ = auVar217._12_4_ * auVar217._12_4_;
          auVar190 = vfmadd213ps_fma(auVar190,auVar155,auVar217);
          auVar104._0_4_ = auVar190._0_4_ + 1.0;
          auVar104._4_4_ = auVar190._4_4_ + 1.0;
          auVar104._8_4_ = auVar190._8_4_ + 1.0;
          auVar104._12_4_ = auVar190._12_4_ + 1.0;
          auVar156._0_4_ = (int)auVar134._0_4_;
          auVar156._4_4_ = (int)auVar134._4_4_;
          auVar156._8_4_ = (int)auVar134._8_4_;
          auVar156._12_4_ = (int)auVar134._12_4_;
          auVar134 = vpslld_avx(auVar156,0x17);
          auVar134 = vpaddd_avx(auVar134,auVar269);
          auVar134 = vfmadd213ps_fma(auVar134,auVar104,auVar269);
          auVar105._8_4_ = 0x40000000;
          auVar105._0_8_ = 0x4000000040000000;
          auVar105._12_4_ = 0x40000000;
          auVar134 = vdivps_avx(auVar105,auVar134);
          auVar70 = vfmsub231ps_fma(auVar70,auVar70,auVar134);
          break;
        case 6:
          puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar20;
          auVar111._4_4_ = uVar1;
          auVar111._0_4_ = uVar1;
          auVar111._8_4_ = uVar1;
          auVar111._12_4_ = uVar1;
          uVar1 = puVar20[1];
          auVar160._4_4_ = uVar1;
          auVar160._0_4_ = uVar1;
          auVar160._8_4_ = uVar1;
          auVar160._12_4_ = uVar1;
          auVar134 = vfmadd231ps_fma(auVar160,auVar70,auVar111);
          auVar134 = vmaxps_avx(auVar134,ZEXT416(0) << 0x20);
          auVar161._8_4_ = 0x3f800000;
          auVar161._0_8_ = 0x3f8000003f800000;
          auVar161._12_4_ = 0x3f800000;
          auVar134 = vminps_avx(auVar134,auVar161);
          auVar70._0_4_ = auVar134._0_4_ * auVar70._0_4_;
          auVar70._4_4_ = auVar134._4_4_ * auVar70._4_4_;
          auVar70._8_4_ = auVar134._8_4_ * auVar70._8_4_;
          auVar70._12_4_ = auVar134._12_4_ * auVar70._12_4_;
        }
        uVar36 = CONCAT44(uStack_2b4,local_2b8);
        *(undefined1 (*) [16])((long)top_blob->data + uVar36 * 4) = auVar70;
        uVar32 = local_288._0_4_;
        auVar134 = local_288;
      }
      local_288 = auVar134;
      iVar33 = (int)uVar36 + uVar32 * 4;
      iVar43 = 0;
      if (iVar33 < (int)uVar34) {
        local_328._0_4_ = uVar53 & 0xfffffff8;
        uVar36 = (ulong)iVar33;
        do {
          auVar288 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar19 != (void *)0x0) {
            auVar288 = ZEXT464(*(uint *)((long)pvVar19 + uVar36 * 4));
          }
          fVar96 = auVar288._0_4_;
          pauVar55 = (undefined1 (*) [16])
                     ((long)(this->weight_data_tm).w * uVar36 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          pauVar40 = local_3b8;
          if ((int)uVar53 < 8) {
            uVar34 = 0;
            _local_218 = SUB6432(ZEXT864(0),0);
          }
          else {
            auVar131 = ZEXT864(0);
            iVar43 = 7;
            do {
              auVar134 = vlddqu_avx(*pauVar55);
              auVar272 = vcvtph2ps_f16c(auVar134);
              auVar134 = vfmadd231ps_fma(auVar131._0_32_,auVar272,*pauVar40);
              auVar131 = ZEXT1664(auVar134);
              _local_218 = ZEXT1632(auVar134);
              pauVar40 = pauVar40 + 1;
              pauVar55 = pauVar55 + 1;
              iVar43 = iVar43 + 8;
            } while (iVar43 < (int)uVar53);
            uVar34 = local_328._0_4_;
          }
          _local_318 = ZEXT816(0) << 0x40;
          uVar32 = uVar34 | 3;
          while ((int)uVar32 < (int)uVar53) {
            auVar16._8_8_ = 0;
            auVar16._0_8_ = *(ulong *)*pauVar55;
            auVar134 = vcvtph2ps_f16c(auVar16);
            _local_318 = vfmadd231ps_fma(_local_318,auVar134,*(undefined1 (*) [16])*pauVar40);
            pauVar40 = (undefined1 (*) [32])(*pauVar40 + 0x10);
            pauVar55 = (undefined1 (*) [16])(*pauVar55 + 8);
            uVar32 = uVar34 + 7;
            uVar34 = uVar34 + 4;
          }
          if ((int)uVar34 < (int)uVar53) {
            lVar44 = 0;
            do {
              local_2a8._0_4_ = auVar288._0_4_;
              uVar32 = *(uint *)(*pauVar40 + lVar44 * 4);
              auVar188._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar55 + lVar44 * 2));
              auVar188._4_60_ = extraout_var_01;
              auVar134 = vfmadd231ss_fma(ZEXT416((uint)local_2a8._0_4_),auVar188._0_16_,
                                         ZEXT416(uVar32));
              fVar96 = auVar134._0_4_;
              auVar288 = ZEXT1664(auVar134);
              lVar44 = lVar44 + 1;
            } while (uVar53 - uVar34 != (int)lVar44);
          }
          auVar75._0_4_ = (float)local_218._0_4_ + (float)local_318._0_4_ + fStack_208;
          auVar75._4_4_ = (float)local_218._4_4_ + (float)local_318._4_4_ + fStack_204;
          auVar75._8_4_ = fStack_210 + fStack_310 + fStack_200;
          auVar75._12_4_ = fStack_20c + fStack_30c + fStack_1fc;
          auVar134 = vhaddps_avx(auVar75,auVar75);
          auVar134 = vhaddps_avx(auVar134,auVar134);
          fVar96 = auVar134._0_4_ + fVar96;
          auVar134 = ZEXT416((uint)fVar96);
          fVar132 = fVar96;
          switch(iVar17) {
          case 1:
            auVar134 = vmaxss_avx(auVar134,ZEXT416(0));
            fVar132 = auVar134._0_4_;
            break;
          case 2:
            auVar134 = vcmpss_avx(ZEXT816(0) << 0x20,auVar134,1);
            auVar163._8_4_ = 0x3f800000;
            auVar163._0_8_ = 0x3f8000003f800000;
            auVar163._12_4_ = 0x3f800000;
            auVar134 = vblendvps_avx(ZEXT416(*(this->super_InnerProduct).activation_params.data),
                                     auVar163,auVar134);
            fVar132 = auVar134._0_4_ * fVar96;
            break;
          case 3:
            puVar23 = (uint *)(this->super_InnerProduct).activation_params.data;
            fVar96 = (float)puVar23[1];
            auVar134 = vmaxss_avx(auVar134,ZEXT416(*puVar23));
            fVar132 = auVar134._0_4_;
            if (fVar96 < auVar134._0_4_) {
              fVar132 = fVar96;
            }
            break;
          case 4:
            auVar134 = vminss_avx(auVar134,ZEXT416(0x42b0c0a5));
            auVar112._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
            auVar112._8_4_ = auVar134._8_4_ ^ 0x80000000;
            auVar112._12_4_ = auVar134._12_4_ ^ 0x80000000;
            auVar134 = vcmpss_avx(auVar134,ZEXT416(0xc2b0c0a5),1);
            auVar162._8_4_ = 0x42b0c0a5;
            auVar162._0_8_ = 0x42b0c0a542b0c0a5;
            auVar162._12_4_ = 0x42b0c0a5;
            auVar134 = vblendvps_avx(auVar112,auVar162,auVar134);
            fVar96 = expf(auVar134._0_4_);
            fVar132 = 1.0 / (fVar96 + 1.0);
            break;
          case 5:
            local_2a8._0_4_ = fVar96;
            fVar96 = expf(fVar96);
            fVar96 = logf(fVar96 + 1.0);
            fVar132 = tanhf(fVar96);
            fVar132 = fVar132 * (float)local_2a8._0_4_;
            break;
          case 6:
            pfVar24 = (float *)(this->super_InnerProduct).activation_params.data;
            fVar307 = *pfVar24;
            fVar319 = pfVar24[1];
            fVar189 = -fVar319 / fVar307;
            fVar132 = 0.0;
            if ((fVar189 <= fVar96) && (fVar132 = fVar96, fVar96 <= fVar189 + 1.0 / fVar307)) {
              auVar134 = vfmadd213ss_fma(ZEXT416((uint)fVar307),auVar134,ZEXT416((uint)fVar319));
              fVar132 = auVar134._0_4_ * fVar96;
            }
          }
          *(float *)((long)top_blob->data + uVar36 * 4) = fVar132;
          uVar36 = uVar36 + 1;
        } while (uVar36 != local_238);
        iVar43 = 0;
      }
    }
    else if (iVar33 == 4) {
      if (0 < (int)uVar34) {
        uVar36 = 0;
        auVar288 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          auVar134 = ZEXT816(0) << 0x40;
          if (pvVar19 != (void *)0x0) {
            auVar134 = *(undefined1 (*) [16])((long)pvVar19 + uVar36 * 0x10);
          }
          pauVar40 = (undefined1 (*) [32])
                     ((long)(this->weight_data_tm).w * uVar36 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          pauVar37 = local_3b8;
          if ((int)uVar53 < 8) {
            auVar92 = SUB6432(ZEXT864(0),0);
            auVar272 = SUB6432(ZEXT864(0),0);
            auVar188 = ZEXT864(0);
            auVar131 = ZEXT864(0);
            uVar32 = 0;
          }
          else {
            auVar131 = ZEXT864(0);
            iVar43 = 7;
            auVar188 = ZEXT864(0);
            auVar213 = ZEXT864(0);
            auVar379 = ZEXT864(0);
            do {
              uVar1 = *(undefined4 *)*pauVar37;
              auVar239._4_4_ = uVar1;
              auVar239._0_4_ = uVar1;
              auVar239._8_4_ = uVar1;
              auVar239._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 4);
              auVar239._20_4_ = uVar1;
              auVar239._16_4_ = uVar1;
              auVar239._24_4_ = uVar1;
              auVar239._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 8);
              auVar332._4_4_ = uVar1;
              auVar332._0_4_ = uVar1;
              auVar332._8_4_ = uVar1;
              auVar332._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 0xc);
              auVar332._20_4_ = uVar1;
              auVar332._16_4_ = uVar1;
              auVar332._24_4_ = uVar1;
              auVar332._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 0x10);
              auVar352._4_4_ = uVar1;
              auVar352._0_4_ = uVar1;
              auVar352._8_4_ = uVar1;
              auVar352._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 0x14);
              auVar352._20_4_ = uVar1;
              auVar352._16_4_ = uVar1;
              auVar352._24_4_ = uVar1;
              auVar352._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 0x18);
              auVar358._4_4_ = uVar1;
              auVar358._0_4_ = uVar1;
              auVar358._8_4_ = uVar1;
              auVar358._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 0x1c);
              auVar358._20_4_ = uVar1;
              auVar358._16_4_ = uVar1;
              auVar358._24_4_ = uVar1;
              auVar358._28_4_ = uVar1;
              auVar272 = vlddqu_avx(*pauVar40);
              auVar92 = vlddqu_avx(pauVar40[1]);
              auVar79 = vcvtph2ps_f16c(auVar272._0_16_);
              auVar190 = vfmadd231ps_fma(auVar131._0_32_,auVar239,auVar79);
              auVar131 = ZEXT1664(auVar190);
              auVar272 = vcvtph2ps_f16c(auVar272._16_16_);
              auVar190 = vfmadd231ps_fma(auVar188._0_32_,auVar332,auVar272);
              auVar188 = ZEXT1664(auVar190);
              auVar272 = vcvtph2ps_f16c(auVar92._0_16_);
              auVar190 = vfmadd231ps_fma(auVar213._0_32_,auVar352,auVar272);
              auVar213 = ZEXT1664(auVar190);
              auVar272 = ZEXT1632(auVar190);
              auVar92 = vcvtph2ps_f16c(auVar92._16_16_);
              auVar190 = vfmadd231ps_fma(auVar379._0_32_,auVar358,auVar92);
              auVar379 = ZEXT1664(auVar190);
              auVar92 = ZEXT1632(auVar190);
              pauVar37 = pauVar37 + 1;
              pauVar40 = pauVar40 + 2;
              iVar43 = iVar43 + 8;
              uVar32 = uVar53 & 0xfffffff8;
            } while (iVar43 < (int)uVar53);
          }
          auVar90 = auVar131._0_32_;
          auVar79 = auVar188._0_32_;
          uVar48 = uVar32 | 3;
          while ((int)uVar48 < (int)uVar53) {
            uVar1 = *(undefined4 *)*pauVar37;
            auVar240._4_4_ = uVar1;
            auVar240._0_4_ = uVar1;
            auVar240._8_4_ = uVar1;
            auVar240._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar37 + 4);
            auVar240._20_4_ = uVar1;
            auVar240._16_4_ = uVar1;
            auVar240._24_4_ = uVar1;
            auVar240._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar37 + 8);
            auVar333._4_4_ = uVar1;
            auVar333._0_4_ = uVar1;
            auVar333._8_4_ = uVar1;
            auVar333._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar37 + 0xc);
            auVar333._20_4_ = uVar1;
            auVar333._16_4_ = uVar1;
            auVar333._24_4_ = uVar1;
            auVar333._28_4_ = uVar1;
            auVar79 = vlddqu_avx(*pauVar40);
            auVar90 = vcvtph2ps_f16c(auVar79._0_16_);
            auVar190 = vfmadd231ps_fma(auVar131._0_32_,auVar240,auVar90);
            auVar131 = ZEXT1664(auVar190);
            auVar90 = ZEXT1632(auVar190);
            auVar79 = vcvtph2ps_f16c(auVar79._16_16_);
            auVar190 = vfmadd231ps_fma(auVar188._0_32_,auVar333,auVar79);
            auVar188 = ZEXT1664(auVar190);
            auVar79 = ZEXT1632(auVar190);
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar40 = pauVar40 + 1;
            uVar48 = uVar32 + 7;
            uVar32 = uVar32 + 4;
          }
          if (uVar53 - uVar32 != 0 && (int)uVar32 <= (int)uVar53) {
            lVar44 = 0;
            do {
              auVar12._8_8_ = 0;
              auVar12._0_8_ = *(ulong *)(*pauVar40 + lVar44 * 8);
              auVar190 = vcvtph2ps_f16c(auVar12);
              uVar1 = *(undefined4 *)(*pauVar37 + lVar44 * 4);
              auVar326._4_4_ = uVar1;
              auVar326._0_4_ = uVar1;
              auVar326._8_4_ = uVar1;
              auVar326._12_4_ = uVar1;
              auVar134 = vfmadd231ps_fma(auVar134,auVar326,auVar190);
              lVar44 = lVar44 + 1;
            } while (uVar53 - uVar32 != (int)lVar44);
          }
          fVar96 = auVar92._4_4_ + auVar272._4_4_ + auVar79._4_4_ + auVar90._4_4_;
          auVar97._0_4_ =
               auVar134._0_4_ +
               auVar92._16_4_ + auVar272._16_4_ + auVar79._16_4_ + auVar90._16_4_ +
               auVar92._0_4_ + auVar272._0_4_ + auVar79._0_4_ + auVar90._0_4_;
          auVar97._4_4_ = auVar134._4_4_ + fVar96 + fVar96;
          auVar97._8_4_ =
               auVar134._8_4_ +
               auVar92._24_4_ + auVar272._24_4_ + auVar79._24_4_ + auVar90._24_4_ +
               auVar92._8_4_ + auVar272._8_4_ + auVar79._8_4_ + auVar90._8_4_;
          auVar97._12_4_ =
               auVar134._12_4_ +
               auVar92._28_4_ + auVar272._28_4_ + auVar79._28_4_ + auVar90._28_4_ +
               auVar92._12_4_ + auVar272._12_4_ + auVar79._12_4_ + auVar90._12_4_;
          auVar134 = auVar288._0_16_;
          fVar96 = auVar288._0_4_;
          fVar132 = auVar288._4_4_;
          fVar307 = auVar288._8_4_;
          fVar319 = auVar288._12_4_;
          switch(iVar17) {
          case 1:
            auVar97 = vmaxps_avx(auVar97,_DAT_005f0030);
            break;
          case 2:
            auVar134 = vmaxps_avx(auVar97,ZEXT816(0) << 0x40);
            auVar190 = vminps_avx(auVar97,ZEXT816(0) << 0x40);
            uVar1 = *(this->super_InnerProduct).activation_params.data;
            auVar100._4_4_ = uVar1;
            auVar100._0_4_ = uVar1;
            auVar100._8_4_ = uVar1;
            auVar100._12_4_ = uVar1;
            auVar97 = vfmadd213ps_fma(auVar100,auVar190,auVar134);
            break;
          case 3:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar20;
            auVar138._4_4_ = uVar1;
            auVar138._0_4_ = uVar1;
            auVar138._8_4_ = uVar1;
            auVar138._12_4_ = uVar1;
            uVar1 = puVar20[1];
            auVar196._4_4_ = uVar1;
            auVar196._0_4_ = uVar1;
            auVar196._8_4_ = uVar1;
            auVar196._12_4_ = uVar1;
            auVar134 = vmaxps_avx(auVar97,auVar138);
            auVar97 = vminps_avx(auVar134,auVar196);
            break;
          case 4:
            uVar31 = CONCAT44(auVar97._4_4_,auVar97._0_4_);
            auVar98._0_8_ = uVar31 ^ 0x8000000080000000;
            auVar98._8_4_ = -auVar97._8_4_;
            auVar98._12_4_ = -auVar97._12_4_;
            auVar139._8_4_ = 0x42b0c0a5;
            auVar139._0_8_ = 0x42b0c0a542b0c0a5;
            auVar139._12_4_ = 0x42b0c0a5;
            auVar190 = vminps_avx(auVar98,auVar139);
            auVar140._8_4_ = 0xc2b0c0a5;
            auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar140._12_4_ = 0xc2b0c0a5;
            auVar101 = vmaxps_avx(auVar190,auVar140);
            auVar141._8_4_ = 0x3fb8aa3b;
            auVar141._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar141._12_4_ = 0x3fb8aa3b;
            auVar245._8_4_ = 0x3f000000;
            auVar245._0_8_ = 0x3f0000003f000000;
            auVar245._12_4_ = 0x3f000000;
            auVar190 = vfmadd213ps_fma(auVar141,auVar101,auVar245);
            auVar197._0_4_ = (int)auVar190._0_4_;
            auVar197._4_4_ = (int)auVar190._4_4_;
            auVar197._8_4_ = (int)auVar190._8_4_;
            auVar197._12_4_ = (int)auVar190._12_4_;
            auVar217 = vcvtdq2ps_avx(auVar197);
            auVar190 = vcmpps_avx(auVar190,auVar217,1);
            auVar190 = vandps_avx(auVar190,auVar134);
            auVar190 = vsubps_avx(auVar217,auVar190);
            auVar66._8_4_ = 0x3f318000;
            auVar66._0_8_ = 0x3f3180003f318000;
            auVar66._12_4_ = 0x3f318000;
            auVar217 = vfmsub231ps_fma(auVar101,auVar190,auVar66);
            auVar198._8_4_ = 0x395e8083;
            auVar198._0_8_ = 0x395e8083395e8083;
            auVar198._12_4_ = 0x395e8083;
            auVar101 = vfmsub231ps_fma(auVar217,auVar190,auVar198);
            auVar199._0_4_ = auVar101._0_4_ * auVar101._0_4_;
            auVar199._4_4_ = auVar101._4_4_ * auVar101._4_4_;
            auVar199._8_4_ = auVar101._8_4_ * auVar101._8_4_;
            auVar199._12_4_ = auVar101._12_4_ * auVar101._12_4_;
            auVar221._8_4_ = 0x39506967;
            auVar221._0_8_ = 0x3950696739506967;
            auVar221._12_4_ = 0x39506967;
            auVar312._8_4_ = 0x3ab743ce;
            auVar312._0_8_ = 0x3ab743ce3ab743ce;
            auVar312._12_4_ = 0x3ab743ce;
            auVar217 = vfmadd213ps_fma(auVar221,auVar101,auVar312);
            auVar290._8_4_ = 0x3c088908;
            auVar290._0_8_ = 0x3c0889083c088908;
            auVar290._12_4_ = 0x3c088908;
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar290);
            auVar67._8_4_ = 0x3d2aa9c1;
            auVar67._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar67._12_4_ = 0x3d2aa9c1;
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar67);
            auVar68._8_4_ = 0x3e2aaaaa;
            auVar68._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar68._12_4_ = 0x3e2aaaaa;
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar68);
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar245);
            auVar217 = vfmadd213ps_fma(auVar217,auVar199,auVar101);
            auVar99._0_4_ = auVar217._0_4_ + fVar96;
            auVar99._4_4_ = auVar217._4_4_ + fVar132;
            auVar99._8_4_ = auVar217._8_4_ + fVar307;
            auVar99._12_4_ = auVar217._12_4_ + fVar319;
            auVar142._0_4_ = (int)auVar190._0_4_;
            auVar142._4_4_ = (int)auVar190._4_4_;
            auVar142._8_4_ = (int)auVar190._8_4_;
            auVar142._12_4_ = (int)auVar190._12_4_;
            auVar190 = vpslld_avx(auVar142,0x17);
            auVar190 = vpaddd_avx(auVar190,auVar134);
            auVar190 = vfmadd213ps_fma(auVar190,auVar99,auVar134);
            auVar97 = vdivps_avx(auVar134,auVar190);
            break;
          case 5:
            auVar348._8_4_ = 0x42b0c0a5;
            auVar348._0_8_ = 0x42b0c0a542b0c0a5;
            auVar348._12_4_ = 0x42b0c0a5;
            auVar190 = vminps_avx(auVar348,auVar97);
            auVar355._8_4_ = 0xc2b0c0a5;
            auVar355._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar355._12_4_ = 0xc2b0c0a5;
            auVar101 = vmaxps_avx(auVar355,auVar190);
            auVar361._8_4_ = 0x3fb8aa3b;
            auVar361._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar361._12_4_ = 0x3fb8aa3b;
            auVar244._8_4_ = 0x3f000000;
            auVar244._0_8_ = 0x3f0000003f000000;
            auVar244._12_4_ = 0x3f000000;
            auVar190 = vfmadd213ps_fma(auVar361,auVar101,auVar244);
            auVar214._0_4_ = (int)auVar190._0_4_;
            auVar214._4_4_ = (int)auVar190._4_4_;
            auVar214._8_4_ = (int)auVar190._8_4_;
            auVar214._12_4_ = (int)auVar190._12_4_;
            auVar217 = vcvtdq2ps_avx(auVar214);
            auVar190 = vcmpps_avx(auVar190,auVar217,1);
            auVar190 = vandps_avx(auVar190,auVar134);
            auVar190 = vsubps_avx(auVar217,auVar190);
            auVar349._8_4_ = 0x3f318000;
            auVar349._0_8_ = 0x3f3180003f318000;
            auVar349._12_4_ = 0x3f318000;
            auVar217 = vfmsub231ps_fma(auVar101,auVar190,auVar349);
            auVar267._8_4_ = 0xb95e8083;
            auVar267._0_8_ = 0xb95e8083b95e8083;
            auVar267._12_4_ = 0xb95e8083;
            auVar101 = vfnmsub231ps_fma(auVar217,auVar190,auVar267);
            auVar215._0_4_ = auVar101._0_4_ * auVar101._0_4_;
            auVar215._4_4_ = auVar101._4_4_ * auVar101._4_4_;
            auVar215._8_4_ = auVar101._8_4_ * auVar101._8_4_;
            auVar215._12_4_ = auVar101._12_4_ * auVar101._12_4_;
            auVar373._8_4_ = 0x39506967;
            auVar373._0_8_ = 0x3950696739506967;
            auVar373._12_4_ = 0x39506967;
            auVar366._8_4_ = 0x3ab743ce;
            auVar366._0_8_ = 0x3ab743ce3ab743ce;
            auVar366._12_4_ = 0x3ab743ce;
            auVar217 = vfmadd213ps_fma(auVar373,auVar101,auVar366);
            auVar289._8_4_ = 0x3c088908;
            auVar289._0_8_ = 0x3c0889083c088908;
            auVar289._12_4_ = 0x3c088908;
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar289);
            auVar327._8_4_ = 0x3d2aa9c1;
            auVar327._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar327._12_4_ = 0x3d2aa9c1;
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar327);
            auVar328._8_4_ = 0x3e2aaaaa;
            auVar328._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar328._12_4_ = 0x3e2aaaaa;
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar328);
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar244);
            auVar217 = vfmadd213ps_fma(auVar217,auVar215,auVar101);
            auVar216._0_4_ = auVar217._0_4_ + fVar96;
            auVar216._4_4_ = auVar217._4_4_ + fVar132;
            auVar216._8_4_ = auVar217._8_4_ + fVar307;
            auVar216._12_4_ = auVar217._12_4_ + fVar319;
            auVar136._0_4_ = (int)auVar190._0_4_;
            auVar136._4_4_ = (int)auVar190._4_4_;
            auVar136._8_4_ = (int)auVar190._8_4_;
            auVar136._12_4_ = (int)auVar190._12_4_;
            auVar190 = vpslld_avx(auVar136,0x17);
            auVar190 = vpaddd_avx(auVar190,auVar134);
            auVar291 = vfmadd213ps_fma(auVar190,auVar216,auVar134);
            auVar191._8_4_ = 0x800000;
            auVar191._0_8_ = 0x80000000800000;
            auVar191._12_4_ = 0x800000;
            auVar190 = vmaxps_avx(auVar291,auVar191);
            auVar217 = vpsrld_avx(auVar190,0x17);
            auVar308._8_4_ = 0xffffff82;
            auVar308._0_8_ = 0xffffff82ffffff82;
            auVar308._12_4_ = 0xffffff82;
            auVar217 = vpaddd_avx(auVar308,auVar217);
            auVar309._8_4_ = 0x807fffff;
            auVar309._0_8_ = 0x807fffff807fffff;
            auVar309._12_4_ = 0x807fffff;
            auVar190 = vandps_avx(auVar309,auVar190);
            auVar268 = vorps_avx(auVar190,auVar244);
            auVar101 = vcvtdq2ps_avx(auVar217);
            auVar310._8_4_ = 0x3f3504f3;
            auVar310._0_8_ = 0x3f3504f33f3504f3;
            auVar310._12_4_ = 0x3f3504f3;
            auVar217 = vcmpps_avx(auVar268,auVar310,1);
            auVar190 = vandps_avx(auVar217,auVar268);
            auVar192._0_4_ = auVar190._0_4_ + auVar268._0_4_ + -1.0;
            auVar192._4_4_ = auVar190._4_4_ + auVar268._4_4_ + -1.0;
            auVar192._8_4_ = auVar190._8_4_ + auVar268._8_4_ + -1.0;
            auVar192._12_4_ = auVar190._12_4_ + auVar268._12_4_ + -1.0;
            auVar190 = vandps_avx(auVar217,auVar134);
            auVar217 = vsubps_avx(auVar101,auVar190);
            auVar311._0_4_ = auVar192._0_4_ * auVar192._0_4_;
            auVar311._4_4_ = auVar192._4_4_ * auVar192._4_4_;
            auVar311._8_4_ = auVar192._8_4_ * auVar192._8_4_;
            auVar311._12_4_ = auVar192._12_4_ * auVar192._12_4_;
            auVar329._8_4_ = 0x3d9021bb;
            auVar329._0_8_ = 0x3d9021bb3d9021bb;
            auVar329._12_4_ = 0x3d9021bb;
            auVar336._8_4_ = 0xbdebd1b8;
            auVar336._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar336._12_4_ = 0xbdebd1b8;
            auVar190 = vfmadd213ps_fma(auVar329,auVar192,auVar336);
            auVar337._8_4_ = 0x3def251a;
            auVar337._0_8_ = 0x3def251a3def251a;
            auVar337._12_4_ = 0x3def251a;
            auVar190 = vfmadd213ps_fma(auVar190,auVar192,auVar337);
            auVar338._8_4_ = 0xbdfe5d4f;
            auVar338._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar338._12_4_ = 0xbdfe5d4f;
            auVar190 = vfmadd213ps_fma(auVar190,auVar192,auVar338);
            auVar339._8_4_ = 0x3e11e9bf;
            auVar339._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar339._12_4_ = 0x3e11e9bf;
            auVar190 = vfmadd213ps_fma(auVar190,auVar192,auVar339);
            auVar340._8_4_ = 0xbe2aae50;
            auVar340._0_8_ = 0xbe2aae50be2aae50;
            auVar340._12_4_ = 0xbe2aae50;
            auVar190 = vfmadd213ps_fma(auVar190,auVar192,auVar340);
            auVar341._8_4_ = 0x3e4cceac;
            auVar341._0_8_ = 0x3e4cceac3e4cceac;
            auVar341._12_4_ = 0x3e4cceac;
            auVar190 = vfmadd213ps_fma(auVar190,auVar192,auVar341);
            auVar342._8_4_ = 0xbe7ffffc;
            auVar342._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar342._12_4_ = 0xbe7ffffc;
            auVar190 = vfmadd213ps_fma(auVar190,auVar192,auVar342);
            auVar343._8_4_ = 0x3eaaaaaa;
            auVar343._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar343._12_4_ = 0x3eaaaaaa;
            auVar190 = vfmadd213ps_fma(auVar190,auVar192,auVar343);
            auVar330._0_4_ = auVar311._0_4_ * auVar192._0_4_ * auVar190._0_4_;
            auVar330._4_4_ = auVar311._4_4_ * auVar192._4_4_ * auVar190._4_4_;
            auVar330._8_4_ = auVar311._8_4_ * auVar192._8_4_ * auVar190._8_4_;
            auVar330._12_4_ = auVar311._12_4_ * auVar192._12_4_ * auVar190._12_4_;
            auVar190 = vfmadd231ps_fma(auVar330,auVar217,auVar267);
            auVar101 = vfmsub231ps_fma(auVar190,auVar244,auVar311);
            auVar190 = vcmpps_avx(auVar291,_DAT_005f0030,2);
            auVar101 = vsubps_avx(auVar101,auVar192);
            auVar217 = vfnmadd231ps_fma(auVar101,auVar349,auVar217);
            auVar193._0_4_ = auVar217._0_4_ + auVar217._0_4_;
            auVar193._4_4_ = auVar217._4_4_ + auVar217._4_4_;
            auVar193._8_4_ = auVar217._8_4_ + auVar217._8_4_;
            auVar193._12_4_ = auVar217._12_4_ + auVar217._12_4_;
            auVar218._8_4_ = 0x7fffffff;
            auVar218._0_8_ = 0x7fffffff7fffffff;
            auVar218._12_4_ = 0x7fffffff;
            auVar190 = vblendvps_avx(auVar193,auVar218,auVar190);
            auVar194._8_4_ = 0x42b0c0a5;
            auVar194._0_8_ = 0x42b0c0a542b0c0a5;
            auVar194._12_4_ = 0x42b0c0a5;
            auVar190 = vminps_avx(auVar190,auVar194);
            auVar101 = vmaxps_avx(auVar355,auVar190);
            auVar190 = vfmadd213ps_fma(auVar361,auVar101,auVar244);
            auVar219._0_4_ = (int)auVar190._0_4_;
            auVar219._4_4_ = (int)auVar190._4_4_;
            auVar219._8_4_ = (int)auVar190._8_4_;
            auVar219._12_4_ = (int)auVar190._12_4_;
            auVar217 = vcvtdq2ps_avx(auVar219);
            auVar190 = vcmpps_avx(auVar190,auVar217,1);
            auVar190 = vandps_avx(auVar190,auVar134);
            auVar190 = vsubps_avx(auVar217,auVar190);
            auVar217 = vfmsub231ps_fma(auVar101,auVar190,auVar349);
            auVar101 = vfnmsub231ps_fma(auVar217,auVar190,auVar267);
            auVar288 = ZEXT1664(auVar134);
            auVar220._0_4_ = auVar101._0_4_ * auVar101._0_4_;
            auVar220._4_4_ = auVar101._4_4_ * auVar101._4_4_;
            auVar220._8_4_ = auVar101._8_4_ * auVar101._8_4_;
            auVar220._12_4_ = auVar101._12_4_ * auVar101._12_4_;
            auVar217 = vfmadd213ps_fma(auVar373,auVar101,auVar366);
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar289);
            auVar63._8_4_ = 0x3d2aa9c1;
            auVar63._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar63._12_4_ = 0x3d2aa9c1;
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar63);
            auVar64._8_4_ = 0x3e2aaaaa;
            auVar64._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar64._12_4_ = 0x3e2aaaaa;
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar64);
            auVar217 = vfmadd213ps_fma(auVar217,auVar101,auVar244);
            auVar217 = vfmadd213ps_fma(auVar217,auVar220,auVar101);
            auVar137._0_4_ = auVar217._0_4_ + fVar96;
            auVar137._4_4_ = auVar217._4_4_ + fVar132;
            auVar137._8_4_ = auVar217._8_4_ + fVar307;
            auVar137._12_4_ = auVar217._12_4_ + fVar319;
            auVar195._0_4_ = (int)auVar190._0_4_;
            auVar195._4_4_ = (int)auVar190._4_4_;
            auVar195._8_4_ = (int)auVar190._8_4_;
            auVar195._12_4_ = (int)auVar190._12_4_;
            auVar190 = vpslld_avx(auVar195,0x17);
            auVar190 = vpaddd_avx(auVar190,auVar134);
            auVar134 = vfmadd213ps_fma(auVar190,auVar137,auVar134);
            auVar65._8_4_ = 0x40000000;
            auVar65._0_8_ = 0x4000000040000000;
            auVar65._12_4_ = 0x40000000;
            auVar134 = vdivps_avx(auVar65,auVar134);
            auVar97 = vfmsub231ps_fma(auVar97,auVar97,auVar134);
            break;
          case 6:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar20;
            auVar143._4_4_ = uVar1;
            auVar143._0_4_ = uVar1;
            auVar143._8_4_ = uVar1;
            auVar143._12_4_ = uVar1;
            uVar1 = puVar20[1];
            auVar200._4_4_ = uVar1;
            auVar200._0_4_ = uVar1;
            auVar200._8_4_ = uVar1;
            auVar200._12_4_ = uVar1;
            auVar190 = vfmadd231ps_fma(auVar200,auVar97,auVar143);
            auVar190 = vmaxps_avx(auVar190,_DAT_005f0030);
            auVar134 = vminps_avx(auVar190,auVar134);
            auVar97._0_4_ = auVar134._0_4_ * auVar97._0_4_;
            auVar97._4_4_ = auVar134._4_4_ * auVar97._4_4_;
            auVar97._8_4_ = auVar134._8_4_ * auVar97._8_4_;
            auVar97._12_4_ = auVar134._12_4_ * auVar97._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar36 * 0x10) = auVar97;
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar34);
      }
      iVar43 = 0;
    }
    else if (iVar33 == 8) {
      if (0 < (int)uVar34) {
        uVar36 = 0;
        auVar288 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        do {
          auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar19 != (void *)0x0) {
            auVar131 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar19 + uVar36 * 0x20));
          }
          pauVar40 = (undefined1 (*) [32])
                     ((long)(this->weight_data_tm).w * uVar36 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          pauVar37 = local_3b8;
          if ((int)uVar53 < 8) {
            auVar92 = SUB6432(ZEXT864(0),0);
            auVar90 = SUB6432(ZEXT864(0),0);
            auVar272 = SUB6432(ZEXT864(0),0);
            auVar79 = SUB6432(ZEXT864(0),0);
            auVar188 = ZEXT864(0);
            auVar213 = ZEXT864(0);
            auVar379 = ZEXT864(0);
            uVar32 = 0;
          }
          else {
            auVar379 = ZEXT864(0);
            iVar43 = 7;
            auVar213 = ZEXT864(0);
            auVar188 = ZEXT864(0);
            auVar354 = ZEXT864(0);
            auVar266 = ZEXT864(0);
            auVar360 = ZEXT864(0);
            auVar335 = ZEXT864(0);
            do {
              uVar1 = *(undefined4 *)*pauVar37;
              auVar362._4_4_ = uVar1;
              auVar362._0_4_ = uVar1;
              auVar362._8_4_ = uVar1;
              auVar362._12_4_ = uVar1;
              auVar362._16_4_ = uVar1;
              auVar362._20_4_ = uVar1;
              auVar362._24_4_ = uVar1;
              auVar362._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 4);
              auVar370._4_4_ = uVar1;
              auVar370._0_4_ = uVar1;
              auVar370._8_4_ = uVar1;
              auVar370._12_4_ = uVar1;
              auVar370._16_4_ = uVar1;
              auVar370._20_4_ = uVar1;
              auVar370._24_4_ = uVar1;
              auVar370._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 8);
              auVar345._4_4_ = uVar1;
              auVar345._0_4_ = uVar1;
              auVar345._8_4_ = uVar1;
              auVar345._12_4_ = uVar1;
              auVar345._16_4_ = uVar1;
              auVar345._20_4_ = uVar1;
              auVar345._24_4_ = uVar1;
              auVar345._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 0xc);
              auVar293._4_4_ = uVar1;
              auVar293._0_4_ = uVar1;
              auVar293._8_4_ = uVar1;
              auVar293._12_4_ = uVar1;
              auVar293._16_4_ = uVar1;
              auVar293._20_4_ = uVar1;
              auVar293._24_4_ = uVar1;
              auVar293._28_4_ = uVar1;
              auVar272 = vlddqu_avx(*pauVar40);
              auVar92 = vlddqu_avx(pauVar40[1]);
              auVar79 = vcvtph2ps_f16c(auVar272._0_16_);
              auVar134 = vfmadd231ps_fma(auVar131._0_32_,auVar362,auVar79);
              auVar131 = ZEXT1664(auVar134);
              auVar272 = vcvtph2ps_f16c(auVar272._16_16_);
              auVar134 = vfmadd231ps_fma(auVar379._0_32_,auVar370,auVar272);
              auVar379 = ZEXT1664(auVar134);
              auVar272 = vcvtph2ps_f16c(auVar92._0_16_);
              auVar134 = vfmadd231ps_fma(auVar213._0_32_,auVar345,auVar272);
              auVar213 = ZEXT1664(auVar134);
              auVar272 = vcvtph2ps_f16c(auVar92._16_16_);
              auVar134 = vfmadd231ps_fma(auVar188._0_32_,auVar293,auVar272);
              auVar188 = ZEXT1664(auVar134);
              uVar1 = *(undefined4 *)(*pauVar37 + 0x10);
              auVar76._4_4_ = uVar1;
              auVar76._0_4_ = uVar1;
              auVar76._8_4_ = uVar1;
              auVar76._12_4_ = uVar1;
              auVar76._16_4_ = uVar1;
              auVar76._20_4_ = uVar1;
              auVar76._24_4_ = uVar1;
              auVar76._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 0x14);
              auVar235._4_4_ = uVar1;
              auVar235._0_4_ = uVar1;
              auVar235._8_4_ = uVar1;
              auVar235._12_4_ = uVar1;
              auVar235._16_4_ = uVar1;
              auVar235._20_4_ = uVar1;
              auVar235._24_4_ = uVar1;
              auVar235._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 0x18);
              auVar294._4_4_ = uVar1;
              auVar294._0_4_ = uVar1;
              auVar294._8_4_ = uVar1;
              auVar294._12_4_ = uVar1;
              auVar294._16_4_ = uVar1;
              auVar294._20_4_ = uVar1;
              auVar294._24_4_ = uVar1;
              auVar294._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(*pauVar37 + 0x1c);
              auVar314._4_4_ = uVar1;
              auVar314._0_4_ = uVar1;
              auVar314._8_4_ = uVar1;
              auVar314._12_4_ = uVar1;
              auVar314._16_4_ = uVar1;
              auVar314._20_4_ = uVar1;
              auVar314._24_4_ = uVar1;
              auVar314._28_4_ = uVar1;
              auVar272 = vlddqu_avx(pauVar40[2]);
              auVar92 = vlddqu_avx(pauVar40[3]);
              auVar79 = vcvtph2ps_f16c(auVar272._0_16_);
              auVar134 = vfmadd231ps_fma(auVar354._0_32_,auVar76,auVar79);
              auVar354 = ZEXT1664(auVar134);
              auVar79 = ZEXT1632(auVar134);
              auVar272 = vcvtph2ps_f16c(auVar272._16_16_);
              auVar134 = vfmadd231ps_fma(auVar266._0_32_,auVar235,auVar272);
              auVar266 = ZEXT1664(auVar134);
              auVar272 = ZEXT1632(auVar134);
              auVar90 = vcvtph2ps_f16c(auVar92._0_16_);
              auVar134 = vfmadd231ps_fma(auVar360._0_32_,auVar294,auVar90);
              auVar360 = ZEXT1664(auVar134);
              auVar90 = ZEXT1632(auVar134);
              auVar92 = vcvtph2ps_f16c(auVar92._16_16_);
              auVar134 = vfmadd231ps_fma(auVar335._0_32_,auVar314,auVar92);
              auVar335 = ZEXT1664(auVar134);
              auVar92 = ZEXT1632(auVar134);
              pauVar37 = pauVar37 + 1;
              pauVar40 = pauVar40 + 4;
              iVar43 = iVar43 + 8;
              uVar32 = uVar53 & 0xfffffff8;
            } while (iVar43 < (int)uVar53);
          }
          auVar187 = auVar379._0_32_;
          auVar186 = auVar213._0_32_;
          auVar130 = auVar188._0_32_;
          uVar48 = uVar32 | 3;
          while (auVar114 = auVar131._0_32_, (int)uVar48 < (int)uVar53) {
            uVar1 = *(undefined4 *)*pauVar37;
            auVar77._4_4_ = uVar1;
            auVar77._0_4_ = uVar1;
            auVar77._8_4_ = uVar1;
            auVar77._12_4_ = uVar1;
            auVar77._16_4_ = uVar1;
            auVar77._20_4_ = uVar1;
            auVar77._24_4_ = uVar1;
            auVar77._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar37 + 4);
            auVar236._4_4_ = uVar1;
            auVar236._0_4_ = uVar1;
            auVar236._8_4_ = uVar1;
            auVar236._12_4_ = uVar1;
            auVar236._16_4_ = uVar1;
            auVar236._20_4_ = uVar1;
            auVar236._24_4_ = uVar1;
            auVar236._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar37 + 8);
            auVar295._4_4_ = uVar1;
            auVar295._0_4_ = uVar1;
            auVar295._8_4_ = uVar1;
            auVar295._12_4_ = uVar1;
            auVar295._16_4_ = uVar1;
            auVar295._20_4_ = uVar1;
            auVar295._24_4_ = uVar1;
            auVar295._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar37 + 0xc);
            auVar315._4_4_ = uVar1;
            auVar315._0_4_ = uVar1;
            auVar315._8_4_ = uVar1;
            auVar315._12_4_ = uVar1;
            auVar315._16_4_ = uVar1;
            auVar315._20_4_ = uVar1;
            auVar315._24_4_ = uVar1;
            auVar315._28_4_ = uVar1;
            auVar130 = vlddqu_avx(*pauVar40);
            auVar25 = vlddqu_avx(pauVar40[1]);
            auVar186 = vcvtph2ps_f16c(auVar130._0_16_);
            auVar134 = vfmadd231ps_fma(auVar114,auVar77,auVar186);
            auVar131 = ZEXT1664(auVar134);
            auVar130 = vcvtph2ps_f16c(auVar130._16_16_);
            auVar134 = vfmadd231ps_fma(auVar379._0_32_,auVar236,auVar130);
            auVar379 = ZEXT1664(auVar134);
            auVar187 = ZEXT1632(auVar134);
            auVar130 = vcvtph2ps_f16c(auVar25._0_16_);
            auVar134 = vfmadd231ps_fma(auVar213._0_32_,auVar295,auVar130);
            auVar213 = ZEXT1664(auVar134);
            auVar186 = ZEXT1632(auVar134);
            auVar130 = vcvtph2ps_f16c(auVar25._16_16_);
            auVar134 = vfmadd231ps_fma(auVar188._0_32_,auVar315,auVar130);
            auVar188 = ZEXT1664(auVar134);
            auVar130 = ZEXT1632(auVar134);
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + 0x10);
            pauVar40 = pauVar40 + 2;
            uVar48 = uVar32 + 7;
            uVar32 = uVar32 + 4;
          }
          if (uVar53 - uVar32 != 0 && (int)uVar32 <= (int)uVar53) {
            lVar44 = 0;
            do {
              uVar1 = *(undefined4 *)(*pauVar37 + lVar44 * 4);
              auVar78._4_4_ = uVar1;
              auVar78._0_4_ = uVar1;
              auVar78._8_4_ = uVar1;
              auVar78._12_4_ = uVar1;
              auVar78._16_4_ = uVar1;
              auVar78._20_4_ = uVar1;
              auVar78._24_4_ = uVar1;
              auVar78._28_4_ = uVar1;
              auVar134 = vlddqu_avx(*(undefined1 (*) [16])*pauVar40);
              auVar114 = vcvtph2ps_f16c(auVar134);
              auVar134 = vfmadd231ps_fma(auVar131._0_32_,auVar78,auVar114);
              auVar131 = ZEXT1664(auVar134);
              auVar114 = ZEXT1632(auVar134);
              pauVar40 = (undefined1 (*) [32])(*pauVar40 + 0x10);
              lVar44 = lVar44 + 1;
            } while (uVar53 - uVar32 != (int)lVar44);
          }
          fVar96 = auVar90._0_4_ + auVar92._0_4_ + auVar79._0_4_ + auVar272._0_4_ +
                   auVar187._0_4_ + auVar130._0_4_ + auVar186._0_4_ + auVar114._0_4_;
          fVar132 = auVar90._4_4_ + auVar92._4_4_ + auVar79._4_4_ + auVar272._4_4_ +
                    auVar187._4_4_ + auVar130._4_4_ + auVar186._4_4_ + auVar114._4_4_;
          auVar115._0_8_ = CONCAT44(fVar132,fVar96);
          auVar115._8_4_ =
               auVar90._8_4_ + auVar92._8_4_ + auVar79._8_4_ + auVar272._8_4_ +
               auVar187._8_4_ + auVar130._8_4_ + auVar186._8_4_ + auVar114._8_4_;
          auVar115._12_4_ =
               auVar90._12_4_ + auVar92._12_4_ + auVar79._12_4_ + auVar272._12_4_ +
               auVar187._12_4_ + auVar130._12_4_ + auVar186._12_4_ + auVar114._12_4_;
          auVar115._16_4_ =
               auVar90._16_4_ + auVar92._16_4_ + auVar79._16_4_ + auVar272._16_4_ +
               auVar187._16_4_ + auVar130._16_4_ + auVar186._16_4_ + auVar114._16_4_;
          auVar115._20_4_ =
               auVar90._20_4_ + auVar92._20_4_ + auVar79._20_4_ + auVar272._20_4_ +
               auVar187._20_4_ + auVar130._20_4_ + auVar186._20_4_ + auVar114._20_4_;
          auVar115._24_4_ =
               auVar90._24_4_ + auVar92._24_4_ + auVar79._24_4_ + auVar272._24_4_ +
               auVar187._24_4_ + auVar130._24_4_ + auVar186._24_4_ + auVar114._24_4_;
          auVar115._28_4_ =
               auVar90._28_4_ + auVar92._28_4_ + auVar79._28_4_ + auVar272._28_4_ +
               auVar187._28_4_ + auVar130._28_4_ + auVar186._28_4_ + auVar114._28_4_;
          auVar272 = auVar288._0_32_;
          fVar307 = auVar288._0_4_;
          fVar319 = auVar288._4_4_;
          fVar189 = auVar288._8_4_;
          fVar320 = auVar288._12_4_;
          fVar321 = auVar288._16_4_;
          fVar322 = auVar288._20_4_;
          fVar323 = auVar288._24_4_;
          fVar324 = auVar288._28_4_;
          switch(iVar17) {
          case 1:
            auVar115 = vmaxps_avx(auVar115,_DAT_005f41a0);
            break;
          case 2:
            auVar272 = vmaxps_avx(auVar115,ZEXT432(0) << 0x20);
            auVar92 = vminps_avx(auVar115,ZEXT432(0) << 0x20);
            uVar1 = *(this->super_InnerProduct).activation_params.data;
            auVar120._4_4_ = uVar1;
            auVar120._0_4_ = uVar1;
            auVar120._8_4_ = uVar1;
            auVar120._12_4_ = uVar1;
            auVar120._16_4_ = uVar1;
            auVar120._20_4_ = uVar1;
            auVar120._24_4_ = uVar1;
            auVar120._28_4_ = uVar1;
            auVar134 = vfmadd213ps_fma(auVar120,auVar92,auVar272);
            auVar115 = ZEXT1632(auVar134);
            break;
          case 3:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar20;
            auVar85._4_4_ = uVar1;
            auVar85._0_4_ = uVar1;
            auVar85._8_4_ = uVar1;
            auVar85._12_4_ = uVar1;
            auVar85._16_4_ = uVar1;
            auVar85._20_4_ = uVar1;
            auVar85._24_4_ = uVar1;
            auVar85._28_4_ = uVar1;
            uVar1 = puVar20[1];
            auVar171._4_4_ = uVar1;
            auVar171._0_4_ = uVar1;
            auVar171._8_4_ = uVar1;
            auVar171._12_4_ = uVar1;
            auVar171._16_4_ = uVar1;
            auVar171._20_4_ = uVar1;
            auVar171._24_4_ = uVar1;
            auVar171._28_4_ = uVar1;
            auVar272 = vmaxps_avx(auVar115,auVar85);
            auVar115 = vminps_avx(auVar272,auVar171);
            break;
          case 4:
            auVar86._0_8_ = auVar115._0_8_ ^ 0x8000000080000000;
            auVar86._8_4_ = -auVar115._8_4_;
            auVar86._12_4_ = -auVar115._12_4_;
            auVar86._16_4_ = -auVar115._16_4_;
            auVar86._20_4_ = -auVar115._20_4_;
            auVar86._24_4_ = -auVar115._24_4_;
            auVar86._28_4_ = -auVar115._28_4_;
            auVar116._8_4_ = 0x42b0c0a5;
            auVar116._0_8_ = 0x42b0c0a542b0c0a5;
            auVar116._12_4_ = 0x42b0c0a5;
            auVar116._16_4_ = 0x42b0c0a5;
            auVar116._20_4_ = 0x42b0c0a5;
            auVar116._24_4_ = 0x42b0c0a5;
            auVar116._28_4_ = 0x42b0c0a5;
            auVar92 = vminps_avx(auVar86,auVar116);
            auVar117._8_4_ = 0xc2b0c0a5;
            auVar117._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar117._12_4_ = 0xc2b0c0a5;
            auVar117._16_4_ = 0xc2b0c0a5;
            auVar117._20_4_ = 0xc2b0c0a5;
            auVar117._24_4_ = 0xc2b0c0a5;
            auVar117._28_4_ = 0xc2b0c0a5;
            auVar79 = vmaxps_avx(auVar92,auVar117);
            auVar118._8_4_ = 0x3fb8aa3b;
            auVar118._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar118._12_4_ = 0x3fb8aa3b;
            auVar118._16_4_ = 0x3fb8aa3b;
            auVar118._20_4_ = 0x3fb8aa3b;
            auVar118._24_4_ = 0x3fb8aa3b;
            auVar118._28_4_ = 0x3fb8aa3b;
            auVar238._8_4_ = 0x3f000000;
            auVar238._0_8_ = 0x3f0000003f000000;
            auVar238._12_4_ = 0x3f000000;
            auVar238._16_4_ = 0x3f000000;
            auVar238._20_4_ = 0x3f000000;
            auVar238._24_4_ = 0x3f000000;
            auVar238._28_4_ = 0x3f000000;
            auVar134 = vfmadd213ps_fma(auVar118,auVar79,auVar238);
            auVar90 = vroundps_avx(ZEXT1632(auVar134),1);
            auVar92 = vcmpps_avx(ZEXT1632(auVar134),auVar90,1);
            auVar92 = vandps_avx(auVar92,auVar272);
            auVar92 = vsubps_avx(auVar90,auVar92);
            auVar172._8_4_ = 0x3f318000;
            auVar172._0_8_ = 0x3f3180003f318000;
            auVar172._12_4_ = 0x3f318000;
            auVar172._16_4_ = 0x3f318000;
            auVar172._20_4_ = 0x3f318000;
            auVar172._24_4_ = 0x3f318000;
            auVar172._28_4_ = 0x3f318000;
            auVar134 = vfmsub231ps_fma(auVar79,auVar92,auVar172);
            auVar173._8_4_ = 0x395e8083;
            auVar173._0_8_ = 0x395e8083395e8083;
            auVar173._12_4_ = 0x395e8083;
            auVar173._16_4_ = 0x395e8083;
            auVar173._20_4_ = 0x395e8083;
            auVar173._24_4_ = 0x395e8083;
            auVar173._28_4_ = 0x395e8083;
            auVar190 = vfmsub231ps_fma(ZEXT1632(auVar134),auVar92,auVar173);
            auVar79 = ZEXT1632(auVar190);
            auVar29._28_4_ = 0x395e8083;
            auVar29._0_28_ =
                 ZEXT1628(CONCAT412(auVar190._12_4_ * auVar190._12_4_,
                                    CONCAT48(auVar190._8_4_ * auVar190._8_4_,
                                             CONCAT44(auVar190._4_4_ * auVar190._4_4_,
                                                      auVar190._0_4_ * auVar190._0_4_))));
            auVar208._8_4_ = 0x39506967;
            auVar208._0_8_ = 0x3950696739506967;
            auVar208._12_4_ = 0x39506967;
            auVar208._16_4_ = 0x39506967;
            auVar208._20_4_ = 0x39506967;
            auVar208._24_4_ = 0x39506967;
            auVar208._28_4_ = 0x39506967;
            auVar254._8_4_ = 0x3ab743ce;
            auVar254._0_8_ = 0x3ab743ce3ab743ce;
            auVar254._12_4_ = 0x3ab743ce;
            auVar254._16_4_ = 0x3ab743ce;
            auVar254._20_4_ = 0x3ab743ce;
            auVar254._24_4_ = 0x3ab743ce;
            auVar254._28_4_ = 0x3ab743ce;
            auVar134 = vfmadd213ps_fma(auVar208,auVar79,auVar254);
            auVar255._8_4_ = 0x3c088908;
            auVar255._0_8_ = 0x3c0889083c088908;
            auVar255._12_4_ = 0x3c088908;
            auVar255._16_4_ = 0x3c088908;
            auVar255._20_4_ = 0x3c088908;
            auVar255._24_4_ = 0x3c088908;
            auVar255._28_4_ = 0x3c088908;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar255);
            auVar256._8_4_ = 0x3d2aa9c1;
            auVar256._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar256._12_4_ = 0x3d2aa9c1;
            auVar256._16_4_ = 0x3d2aa9c1;
            auVar256._20_4_ = 0x3d2aa9c1;
            auVar256._24_4_ = 0x3d2aa9c1;
            auVar256._28_4_ = 0x3d2aa9c1;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar256);
            auVar257._8_4_ = 0x3e2aaaaa;
            auVar257._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar257._12_4_ = 0x3e2aaaaa;
            auVar257._16_4_ = 0x3e2aaaaa;
            auVar257._20_4_ = 0x3e2aaaaa;
            auVar257._24_4_ = 0x3e2aaaaa;
            auVar257._28_4_ = 0x3e2aaaaa;
            auVar79 = ZEXT1632(auVar190);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar257);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar238);
            auVar217 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar29,auVar79);
            auVar62._0_4_ = (int)auVar92._0_4_;
            auVar62._4_4_ = (int)auVar92._4_4_;
            auVar62._8_4_ = (int)auVar92._8_4_;
            auVar62._12_4_ = (int)auVar92._12_4_;
            auVar87._16_4_ = (int)auVar92._16_4_;
            auVar87._0_16_ = auVar62;
            auVar87._20_4_ = (int)auVar92._20_4_;
            auVar87._24_4_ = (int)auVar92._24_4_;
            auVar87._28_4_ = (int)auVar92._28_4_;
            auVar190 = vpslld_avx(auVar62,0x17);
            auVar134 = vpslld_avx(auVar87._16_16_,0x17);
            auVar135._8_4_ = 0x3f800000;
            auVar135._0_8_ = 0x3f8000003f800000;
            auVar135._12_4_ = 0x3f800000;
            auVar134 = vpaddd_avx(auVar134,auVar135);
            auVar190 = vpaddd_avx(auVar190,auVar135);
            auVar88._16_16_ = auVar134;
            auVar88._0_16_ = auVar190;
            auVar119._0_4_ = auVar217._0_4_ + fVar307;
            auVar119._4_4_ = auVar217._4_4_ + fVar319;
            auVar119._8_4_ = auVar217._8_4_ + fVar189;
            auVar119._12_4_ = auVar217._12_4_ + fVar320;
            auVar119._16_4_ = fVar321 + 0.0;
            auVar119._20_4_ = fVar322 + 0.0;
            auVar119._24_4_ = fVar323 + 0.0;
            auVar119._28_4_ = fVar324 + 0.0;
            auVar134 = vfmadd213ps_fma(auVar88,auVar119,auVar272);
            auVar115 = vdivps_avx(auVar272,ZEXT1632(auVar134));
            break;
          case 5:
            auVar316._8_4_ = 0x42b0c0a5;
            auVar316._0_8_ = 0x42b0c0a542b0c0a5;
            auVar316._12_4_ = 0x42b0c0a5;
            auVar316._16_4_ = 0x42b0c0a5;
            auVar316._20_4_ = 0x42b0c0a5;
            auVar316._24_4_ = 0x42b0c0a5;
            auVar316._28_4_ = 0x42b0c0a5;
            auVar92 = vminps_avx(auVar316,auVar115);
            auVar331._8_4_ = 0xc2b0c0a5;
            auVar331._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar331._12_4_ = 0xc2b0c0a5;
            auVar331._16_4_ = 0xc2b0c0a5;
            auVar331._20_4_ = 0xc2b0c0a5;
            auVar331._24_4_ = 0xc2b0c0a5;
            auVar331._28_4_ = 0xc2b0c0a5;
            auVar79 = vmaxps_avx(auVar331,auVar92);
            auVar164._8_4_ = 0x3fb8aa3b;
            auVar164._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar164._12_4_ = 0x3fb8aa3b;
            auVar164._16_4_ = 0x3fb8aa3b;
            auVar164._20_4_ = 0x3fb8aa3b;
            auVar164._24_4_ = 0x3fb8aa3b;
            auVar164._28_4_ = 0x3fb8aa3b;
            auVar346._8_4_ = 0x3f000000;
            auVar346._0_8_ = 0x3f0000003f000000;
            auVar346._12_4_ = 0x3f000000;
            auVar346._16_4_ = 0x3f000000;
            auVar346._20_4_ = 0x3f000000;
            auVar346._24_4_ = 0x3f000000;
            auVar346._28_4_ = 0x3f000000;
            auVar134 = vfmadd213ps_fma(auVar164,auVar79,auVar346);
            auVar90 = vroundps_avx(ZEXT1632(auVar134),1);
            auVar92 = vcmpps_avx(ZEXT1632(auVar134),auVar90,1);
            auVar92 = vandps_avx(auVar92,auVar272);
            auVar92 = vsubps_avx(auVar90,auVar92);
            auVar357._8_4_ = 0x3f318000;
            auVar357._0_8_ = 0x3f3180003f318000;
            auVar357._12_4_ = 0x3f318000;
            auVar357._16_4_ = 0x3f318000;
            auVar357._20_4_ = 0x3f318000;
            auVar357._24_4_ = 0x3f318000;
            auVar357._28_4_ = 0x3f318000;
            auVar134 = vfmsub231ps_fma(auVar79,auVar92,auVar357);
            auVar351._8_4_ = 0xb95e8083;
            auVar351._0_8_ = 0xb95e8083b95e8083;
            auVar351._12_4_ = 0xb95e8083;
            auVar351._16_4_ = 0xb95e8083;
            auVar351._20_4_ = 0xb95e8083;
            auVar351._24_4_ = 0xb95e8083;
            auVar351._28_4_ = 0xb95e8083;
            auVar190 = vfnmsub231ps_fma(ZEXT1632(auVar134),auVar92,auVar351);
            auVar79 = ZEXT1632(auVar190);
            auVar26._28_4_ = auVar90._28_4_;
            auVar26._0_28_ =
                 ZEXT1628(CONCAT412(auVar190._12_4_ * auVar190._12_4_,
                                    CONCAT48(auVar190._8_4_ * auVar190._8_4_,
                                             CONCAT44(auVar190._4_4_ * auVar190._4_4_,
                                                      auVar190._0_4_ * auVar190._0_4_))));
            auVar371._8_4_ = 0x39506967;
            auVar371._0_8_ = 0x3950696739506967;
            auVar371._12_4_ = 0x39506967;
            auVar371._16_4_ = 0x39506967;
            auVar371._20_4_ = 0x39506967;
            auVar371._24_4_ = 0x39506967;
            auVar371._28_4_ = 0x39506967;
            auVar363._8_4_ = 0x3ab743ce;
            auVar363._0_8_ = 0x3ab743ce3ab743ce;
            auVar363._12_4_ = 0x3ab743ce;
            auVar363._16_4_ = 0x3ab743ce;
            auVar363._20_4_ = 0x3ab743ce;
            auVar363._24_4_ = 0x3ab743ce;
            auVar363._28_4_ = 0x3ab743ce;
            auVar134 = vfmadd213ps_fma(auVar371,auVar79,auVar363);
            auVar377._8_4_ = 0x3c088908;
            auVar377._0_8_ = 0x3c0889083c088908;
            auVar377._12_4_ = 0x3c088908;
            auVar377._16_4_ = 0x3c088908;
            auVar377._20_4_ = 0x3c088908;
            auVar377._24_4_ = 0x3c088908;
            auVar377._28_4_ = 0x3c088908;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar377);
            auVar273._8_4_ = 0x3d2aa9c1;
            auVar273._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar273._12_4_ = 0x3d2aa9c1;
            auVar273._16_4_ = 0x3d2aa9c1;
            auVar273._20_4_ = 0x3d2aa9c1;
            auVar273._24_4_ = 0x3d2aa9c1;
            auVar273._28_4_ = 0x3d2aa9c1;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar273);
            auVar250._8_4_ = 0x3e2aaaaa;
            auVar250._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar250._12_4_ = 0x3e2aaaaa;
            auVar250._16_4_ = 0x3e2aaaaa;
            auVar250._20_4_ = 0x3e2aaaaa;
            auVar250._24_4_ = 0x3e2aaaaa;
            auVar250._28_4_ = 0x3e2aaaaa;
            auVar79 = ZEXT1632(auVar190);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar250);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar346);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar26,auVar79);
            auVar80._0_4_ = fVar307 + auVar134._0_4_;
            auVar80._4_4_ = fVar319 + auVar134._4_4_;
            auVar80._8_4_ = fVar189 + auVar134._8_4_;
            auVar80._12_4_ = fVar320 + auVar134._12_4_;
            auVar80._16_4_ = fVar321 + 0.0;
            auVar80._20_4_ = fVar322 + 0.0;
            auVar80._24_4_ = fVar323 + 0.0;
            auVar80._28_4_ = fVar324 + 0.0;
            auVar133._0_4_ = (int)auVar92._0_4_;
            auVar133._4_4_ = (int)auVar92._4_4_;
            auVar133._8_4_ = (int)auVar92._8_4_;
            auVar133._12_4_ = (int)auVar92._12_4_;
            auVar165._16_4_ = (int)auVar92._16_4_;
            auVar165._0_16_ = auVar133;
            auVar165._20_4_ = (int)auVar92._20_4_;
            auVar165._24_4_ = (int)auVar92._24_4_;
            auVar165._28_4_ = (int)auVar92._28_4_;
            auVar190 = vpslld_avx(auVar133,0x17);
            auVar134 = vpslld_avx(auVar165._16_16_,0x17);
            auVar325._8_4_ = 0x3f800000;
            auVar325._0_8_ = 0x3f8000003f800000;
            auVar325._12_4_ = 0x3f800000;
            auVar134 = vpaddd_avx(auVar325,auVar134);
            auVar190 = vpaddd_avx(auVar325,auVar190);
            auVar166._16_16_ = auVar134;
            auVar166._0_16_ = auVar190;
            auVar217 = vfmadd213ps_fma(auVar166,auVar80,auVar272);
            auVar81._8_4_ = 0x800000;
            auVar81._0_8_ = 0x80000000800000;
            auVar81._12_4_ = 0x800000;
            auVar81._16_4_ = 0x800000;
            auVar81._20_4_ = 0x800000;
            auVar81._24_4_ = 0x800000;
            auVar81._28_4_ = 0x800000;
            auVar92 = vmaxps_avx(ZEXT1632(auVar217),auVar81);
            auVar190 = vpsrld_avx(auVar92._0_16_,0x17);
            auVar134 = vpsrld_avx(auVar92._16_16_,0x17);
            auVar204._8_4_ = 0x807fffff;
            auVar204._0_8_ = 0x807fffff807fffff;
            auVar204._12_4_ = 0x807fffff;
            auVar204._16_4_ = 0x807fffff;
            auVar204._20_4_ = 0x807fffff;
            auVar204._24_4_ = 0x807fffff;
            auVar204._28_4_ = 0x807fffff;
            auVar92 = vandps_avx(auVar92,auVar204);
            auVar90 = vorps_avx(auVar346,auVar92);
            auVar205._8_4_ = 0x3f3504f3;
            auVar205._0_8_ = 0x3f3504f33f3504f3;
            auVar205._12_4_ = 0x3f3504f3;
            auVar205._16_4_ = 0x3f3504f3;
            auVar205._20_4_ = 0x3f3504f3;
            auVar205._24_4_ = 0x3f3504f3;
            auVar205._28_4_ = 0x3f3504f3;
            auVar79 = vcmpps_avx(auVar205,auVar90,2);
            auVar92 = vandnps_avx(auVar79,auVar90);
            auVar364._8_4_ = 0xbf800000;
            auVar364._0_8_ = 0xbf800000bf800000;
            auVar364._12_4_ = 0xbf800000;
            auVar364._16_4_ = 0xbf800000;
            auVar364._20_4_ = 0xbf800000;
            auVar364._24_4_ = 0xbf800000;
            auVar364._28_4_ = 0xbf800000;
            auVar206._0_4_ = auVar90._0_4_ + -1.0 + auVar92._0_4_;
            auVar206._4_4_ = auVar90._4_4_ + -1.0 + auVar92._4_4_;
            auVar206._8_4_ = auVar90._8_4_ + -1.0 + auVar92._8_4_;
            auVar206._12_4_ = auVar90._12_4_ + -1.0 + auVar92._12_4_;
            auVar206._16_4_ = auVar90._16_4_ + -1.0 + auVar92._16_4_;
            auVar206._20_4_ = auVar90._20_4_ + -1.0 + auVar92._20_4_;
            auVar206._24_4_ = auVar90._24_4_ + -1.0 + auVar92._24_4_;
            auVar206._28_4_ = auVar90._28_4_ + -1.0 + auVar92._28_4_;
            auVar134 = vpsubd_avx(auVar134,auVar79._16_16_);
            auVar243._8_4_ = 0xffffff81;
            auVar243._0_8_ = 0xffffff81ffffff81;
            auVar243._12_4_ = 0xffffff81;
            auVar134 = vpaddd_avx(auVar134,auVar243);
            auVar190 = vpsubd_avx(auVar190,auVar79._0_16_);
            auVar190 = vpaddd_avx(auVar190,auVar243);
            auVar82._16_16_ = auVar134;
            auVar82._0_16_ = auVar190;
            auVar237._0_4_ = auVar206._0_4_ * auVar206._0_4_;
            auVar237._4_4_ = auVar206._4_4_ * auVar206._4_4_;
            auVar237._8_4_ = auVar206._8_4_ * auVar206._8_4_;
            auVar237._12_4_ = auVar206._12_4_ * auVar206._12_4_;
            auVar237._16_4_ = auVar206._16_4_ * auVar206._16_4_;
            auVar237._20_4_ = auVar206._20_4_ * auVar206._20_4_;
            auVar237._24_4_ = auVar206._24_4_ * auVar206._24_4_;
            auVar237._28_4_ = 0;
            auVar251._8_4_ = 0x3d9021bb;
            auVar251._0_8_ = 0x3d9021bb3d9021bb;
            auVar251._12_4_ = 0x3d9021bb;
            auVar251._16_4_ = 0x3d9021bb;
            auVar251._20_4_ = 0x3d9021bb;
            auVar251._24_4_ = 0x3d9021bb;
            auVar251._28_4_ = 0x3d9021bb;
            auVar296._8_4_ = 0xbdebd1b8;
            auVar296._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar296._12_4_ = 0xbdebd1b8;
            auVar296._16_4_ = 0xbdebd1b8;
            auVar296._20_4_ = 0xbdebd1b8;
            auVar296._24_4_ = 0xbdebd1b8;
            auVar296._28_4_ = 0xbdebd1b8;
            auVar134 = vfmadd213ps_fma(auVar251,auVar206,auVar296);
            auVar297._8_4_ = 0x3def251a;
            auVar297._0_8_ = 0x3def251a3def251a;
            auVar297._12_4_ = 0x3def251a;
            auVar297._16_4_ = 0x3def251a;
            auVar297._20_4_ = 0x3def251a;
            auVar297._24_4_ = 0x3def251a;
            auVar297._28_4_ = 0x3def251a;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar206,auVar297);
            auVar298._8_4_ = 0xbdfe5d4f;
            auVar298._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar298._12_4_ = 0xbdfe5d4f;
            auVar298._16_4_ = 0xbdfe5d4f;
            auVar298._20_4_ = 0xbdfe5d4f;
            auVar298._24_4_ = 0xbdfe5d4f;
            auVar298._28_4_ = 0xbdfe5d4f;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar206,auVar298);
            auVar299._8_4_ = 0x3e11e9bf;
            auVar299._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar299._12_4_ = 0x3e11e9bf;
            auVar299._16_4_ = 0x3e11e9bf;
            auVar299._20_4_ = 0x3e11e9bf;
            auVar299._24_4_ = 0x3e11e9bf;
            auVar299._28_4_ = 0x3e11e9bf;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar206,auVar299);
            auVar300._8_4_ = 0xbe2aae50;
            auVar300._0_8_ = 0xbe2aae50be2aae50;
            auVar300._12_4_ = 0xbe2aae50;
            auVar300._16_4_ = 0xbe2aae50;
            auVar300._20_4_ = 0xbe2aae50;
            auVar300._24_4_ = 0xbe2aae50;
            auVar300._28_4_ = 0xbe2aae50;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar206,auVar300);
            auVar301._8_4_ = 0x3e4cceac;
            auVar301._0_8_ = 0x3e4cceac3e4cceac;
            auVar301._12_4_ = 0x3e4cceac;
            auVar301._16_4_ = 0x3e4cceac;
            auVar301._20_4_ = 0x3e4cceac;
            auVar301._24_4_ = 0x3e4cceac;
            auVar301._28_4_ = 0x3e4cceac;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar206,auVar301);
            auVar302._8_4_ = 0xbe7ffffc;
            auVar302._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar302._12_4_ = 0xbe7ffffc;
            auVar302._16_4_ = 0xbe7ffffc;
            auVar302._20_4_ = 0xbe7ffffc;
            auVar302._24_4_ = 0xbe7ffffc;
            auVar302._28_4_ = 0xbe7ffffc;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar206,auVar302);
            auVar303._8_4_ = 0x3eaaaaaa;
            auVar303._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar303._12_4_ = 0x3eaaaaaa;
            auVar303._16_4_ = 0x3eaaaaaa;
            auVar303._20_4_ = 0x3eaaaaaa;
            auVar303._24_4_ = 0x3eaaaaaa;
            auVar303._28_4_ = 0x3eaaaaaa;
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar206,auVar303);
            auVar252._0_4_ = auVar237._0_4_ * auVar206._0_4_ * auVar134._0_4_;
            auVar252._4_4_ = auVar237._4_4_ * auVar206._4_4_ * auVar134._4_4_;
            auVar252._8_4_ = auVar237._8_4_ * auVar206._8_4_ * auVar134._8_4_;
            auVar252._12_4_ = auVar237._12_4_ * auVar206._12_4_ * auVar134._12_4_;
            auVar252._16_4_ = auVar237._16_4_ * auVar206._16_4_ * 0.0;
            auVar252._20_4_ = auVar237._20_4_ * auVar206._20_4_ * 0.0;
            auVar252._24_4_ = auVar237._24_4_ * auVar206._24_4_ * 0.0;
            auVar252._28_4_ = 0;
            auVar79 = vcvtdq2ps_avx(auVar82);
            auVar134 = vfmadd231ps_fma(auVar252,auVar79,auVar351);
            auVar134 = vfmsub231ps_fma(ZEXT1632(auVar134),auVar346,auVar237);
            auVar92 = vcmpps_avx(ZEXT1632(auVar217),_DAT_005f41a0,2);
            auVar90 = vsubps_avx(ZEXT1632(auVar134),auVar206);
            auVar134 = vfmsub231ps_fma(auVar90,auVar357,auVar79);
            auVar253._8_4_ = 0xc0000000;
            auVar253._0_8_ = 0xc0000000c0000000;
            auVar253._12_4_ = 0xc0000000;
            auVar253._16_4_ = 0xc0000000;
            auVar253._20_4_ = 0xc0000000;
            auVar253._24_4_ = 0xc0000000;
            auVar253._28_4_ = 0xc0000000;
            auVar27._4_4_ = auVar134._4_4_ * -2.0;
            auVar27._0_4_ = auVar134._0_4_ * -2.0;
            auVar27._8_4_ = auVar134._8_4_ * -2.0;
            auVar27._12_4_ = auVar134._12_4_ * -2.0;
            auVar27._16_4_ = 0x80000000;
            auVar27._20_4_ = 0x80000000;
            auVar27._24_4_ = 0x80000000;
            auVar27._28_4_ = auVar79._28_4_;
            auVar207._8_4_ = 0x7fffffff;
            auVar207._0_8_ = 0x7fffffff7fffffff;
            auVar207._12_4_ = 0x7fffffff;
            auVar207._16_4_ = 0x7fffffff;
            auVar207._20_4_ = 0x7fffffff;
            auVar207._24_4_ = 0x7fffffff;
            auVar207._28_4_ = 0x7fffffff;
            auVar92 = vblendvps_avx(auVar27,auVar207,auVar92);
            auVar167._8_4_ = 0x42b0c0a5;
            auVar167._0_8_ = 0x42b0c0a542b0c0a5;
            auVar167._12_4_ = 0x42b0c0a5;
            auVar167._16_4_ = 0x42b0c0a5;
            auVar167._20_4_ = 0x42b0c0a5;
            auVar167._24_4_ = 0x42b0c0a5;
            auVar167._28_4_ = 0x42b0c0a5;
            auVar92 = vminps_avx(auVar92,auVar167);
            auVar168._8_4_ = 0xc2b0c0a5;
            auVar168._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar168._12_4_ = 0xc2b0c0a5;
            auVar168._16_4_ = 0xc2b0c0a5;
            auVar168._20_4_ = 0xc2b0c0a5;
            auVar168._24_4_ = 0xc2b0c0a5;
            auVar168._28_4_ = 0xc2b0c0a5;
            auVar79 = vmaxps_avx(auVar92,auVar168);
            auVar169._8_4_ = 0x3fb8aa3b;
            auVar169._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar169._12_4_ = 0x3fb8aa3b;
            auVar169._16_4_ = 0x3fb8aa3b;
            auVar169._20_4_ = 0x3fb8aa3b;
            auVar169._24_4_ = 0x3fb8aa3b;
            auVar169._28_4_ = 0x3fb8aa3b;
            auVar134 = vfmadd213ps_fma(auVar169,auVar79,auVar346);
            auVar90 = vroundps_avx(ZEXT1632(auVar134),1);
            auVar92 = vcmpps_avx(ZEXT1632(auVar134),auVar90,1);
            auVar92 = vandps_avx(auVar272,auVar92);
            auVar92 = vsubps_avx(auVar90,auVar92);
            auVar134 = vfmsub231ps_fma(auVar79,auVar92,auVar357);
            auVar190 = vfnmsub231ps_fma(ZEXT1632(auVar134),auVar92,auVar351);
            auVar79 = ZEXT1632(auVar190);
            auVar28._28_4_ = auVar90._28_4_;
            auVar28._0_28_ =
                 ZEXT1628(CONCAT412(auVar190._12_4_ * auVar190._12_4_,
                                    CONCAT48(auVar190._8_4_ * auVar190._8_4_,
                                             CONCAT44(auVar190._4_4_ * auVar190._4_4_,
                                                      auVar190._0_4_ * auVar190._0_4_))));
            auVar304._8_4_ = 0x3ab743ce;
            auVar304._0_8_ = 0x3ab743ce3ab743ce;
            auVar304._12_4_ = 0x3ab743ce;
            auVar304._16_4_ = 0x3ab743ce;
            auVar304._20_4_ = 0x3ab743ce;
            auVar304._24_4_ = 0x3ab743ce;
            auVar304._28_4_ = 0x3ab743ce;
            auVar134 = vfmadd213ps_fma(auVar371,auVar79,auVar304);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar377);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar273);
            auVar288 = ZEXT3264(auVar272);
            auVar305._8_4_ = 0x3e2aaaaa;
            auVar305._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar305._12_4_ = 0x3e2aaaaa;
            auVar305._16_4_ = 0x3e2aaaaa;
            auVar305._20_4_ = 0x3e2aaaaa;
            auVar305._24_4_ = 0x3e2aaaaa;
            auVar305._28_4_ = 0x3e2aaaaa;
            auVar79 = ZEXT1632(auVar190);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar305);
            auVar134 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar79,auVar346);
            auVar217 = vfmadd213ps_fma(ZEXT1632(auVar134),auVar28,auVar79);
            auVar61._0_4_ = (int)auVar92._0_4_;
            auVar61._4_4_ = (int)auVar92._4_4_;
            auVar61._8_4_ = (int)auVar92._8_4_;
            auVar61._12_4_ = (int)auVar92._12_4_;
            auVar83._16_4_ = (int)auVar92._16_4_;
            auVar83._0_16_ = auVar61;
            auVar83._20_4_ = (int)auVar92._20_4_;
            auVar83._24_4_ = (int)auVar92._24_4_;
            auVar83._28_4_ = (int)auVar92._28_4_;
            auVar190 = vpslld_avx(auVar61,0x17);
            auVar134 = vpslld_avx(auVar83._16_16_,0x17);
            auVar134 = vpaddd_avx(auVar325,auVar134);
            auVar190 = vpaddd_avx(auVar325,auVar190);
            auVar84._16_16_ = auVar134;
            auVar84._0_16_ = auVar190;
            auVar170._0_4_ = fVar307 + auVar217._0_4_;
            auVar170._4_4_ = fVar319 + auVar217._4_4_;
            auVar170._8_4_ = fVar189 + auVar217._8_4_;
            auVar170._12_4_ = fVar320 + auVar217._12_4_;
            auVar170._16_4_ = fVar321 + 0.0;
            auVar170._20_4_ = fVar322 + 0.0;
            auVar170._24_4_ = fVar323 + 0.0;
            auVar170._28_4_ = fVar324 + 0.0;
            auVar134 = vfmadd213ps_fma(auVar84,auVar170,auVar272);
            auVar272 = vdivps_avx(auVar272,ZEXT1632(auVar134));
            auVar134 = vfnmadd213ps_fma(auVar272,auVar253,auVar364);
            auVar113 = ZEXT1628(auVar134);
            goto LAB_00301c34;
          case 6:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar20;
            auVar89._4_4_ = uVar1;
            auVar89._0_4_ = uVar1;
            auVar89._8_4_ = uVar1;
            auVar89._12_4_ = uVar1;
            auVar89._16_4_ = uVar1;
            auVar89._20_4_ = uVar1;
            auVar89._24_4_ = uVar1;
            auVar89._28_4_ = uVar1;
            uVar1 = puVar20[1];
            auVar174._4_4_ = uVar1;
            auVar174._0_4_ = uVar1;
            auVar174._8_4_ = uVar1;
            auVar174._12_4_ = uVar1;
            auVar174._16_4_ = uVar1;
            auVar174._20_4_ = uVar1;
            auVar174._24_4_ = uVar1;
            auVar174._28_4_ = uVar1;
            auVar134 = vfmadd231ps_fma(auVar174,auVar115,auVar89);
            auVar92 = vmaxps_avx(ZEXT1632(auVar134),_DAT_005f41a0);
            auVar272 = vminps_avx(auVar92,auVar272);
            auVar113 = auVar272._0_28_;
LAB_00301c34:
            auVar115._4_4_ = auVar113._4_4_ * fVar132;
            auVar115._0_4_ = auVar113._0_4_ * fVar96;
            auVar115._8_4_ = auVar113._8_4_ * auVar115._8_4_;
            auVar115._12_4_ = auVar113._12_4_ * auVar115._12_4_;
            auVar115._16_4_ = auVar113._16_4_ * auVar115._16_4_;
            auVar115._20_4_ = auVar113._20_4_ * auVar115._20_4_;
            auVar115._24_4_ = auVar113._24_4_ * auVar115._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar36 * 0x20) = auVar115;
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar34);
      }
      iVar43 = 0;
    }
  }
LAB_00302e03:
  piVar18 = (int *)CONCAT44(uStack_3ac,uStack_3b0);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_398 == (Allocator *)0x0) {
        if (local_3b8 != (undefined1 (*) [32])0x0) {
          free(local_3b8);
        }
      }
      else {
        (*local_398->_vptr_Allocator[3])();
      }
    }
  }
  return iVar43;
}

Assistant:

int InnerProduct_x86_fma::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}